

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<8,4>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  long lVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  bool bVar67;
  uint uVar68;
  uint uVar69;
  int iVar70;
  uint uVar71;
  ulong uVar72;
  uint uVar73;
  ulong uVar74;
  long lVar76;
  LinearSpace3fa *pLVar77;
  bool bVar78;
  float t1;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar81 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar123 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar164;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar168;
  float fVar185;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar183;
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar189;
  float fVar208;
  float fVar209;
  undefined1 auVar190 [16];
  float fVar210;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar228;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar219 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  vfloat4 b0;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar284;
  float fVar285;
  vfloat4 a0_1;
  float fVar286;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar287;
  float fVar297;
  float fVar298;
  __m128 a;
  float fVar299;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  float fVar308;
  undefined1 auVar301 [16];
  float fVar305;
  float fVar307;
  float fVar309;
  undefined1 auVar302 [16];
  float fVar304;
  float fVar306;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float in_register_0000151c;
  undefined1 auVar303 [32];
  float fVar316;
  float fVar317;
  float fVar327;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar325;
  float fVar326;
  undefined1 auVar323 [32];
  float fVar328;
  float fVar329;
  undefined1 auVar324 [32];
  float fVar330;
  float fVar340;
  undefined1 auVar332 [16];
  float fVar331;
  float fVar337;
  float fVar339;
  undefined1 auVar333 [16];
  float fVar336;
  float fVar338;
  float in_register_0000159c;
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  vfloat4 a0;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5f9;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  LinearSpace3fa *local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  uint auStack_3b8 [4];
  RTCFilterFunctionNArguments local_3a8;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar75;
  undefined1 auVar161 [32];
  undefined1 auVar345 [32];
  
  PVar9 = prim[1];
  uVar72 = (ulong)(byte)PVar9;
  lVar76 = uVar72 * 5;
  fVar189 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar289 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar289 = vinsertps_avx(auVar289,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar103 = vsubps_avx(auVar103,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  auVar93._0_4_ = fVar189 * auVar103._0_4_;
  auVar93._4_4_ = fVar189 * auVar103._4_4_;
  auVar93._8_4_ = fVar189 * auVar103._8_4_;
  auVar93._12_4_ = fVar189 * auVar103._12_4_;
  auVar190._0_4_ = fVar189 * auVar289._0_4_;
  auVar190._4_4_ = fVar189 * auVar289._4_4_;
  auVar190._8_4_ = fVar189 * auVar289._8_4_;
  auVar190._12_4_ = fVar189 * auVar289._12_4_;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 10)));
  auVar84._16_16_ = auVar289;
  auVar84._0_16_ = auVar103;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar76 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar76 + 10)));
  auVar132._16_16_ = auVar289;
  auVar132._0_16_ = auVar103;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 10)));
  auVar14 = vcvtdq2ps_avx(auVar132);
  auVar154._16_16_ = auVar289;
  auVar154._0_16_ = auVar103;
  auVar15 = vcvtdq2ps_avx(auVar154);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 10)));
  auVar179._16_16_ = auVar289;
  auVar179._0_16_ = auVar103;
  uVar74 = (ulong)((uint)(byte)PVar9 * 0xc);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar179);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 10)));
  auVar224._16_16_ = auVar289;
  auVar224._0_16_ = auVar103;
  auVar17 = vcvtdq2ps_avx(auVar224);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar72 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar72 + 10)));
  auVar236._16_16_ = auVar289;
  auVar236._0_16_ = auVar103;
  auVar18 = vcvtdq2ps_avx(auVar236);
  lVar1 = uVar72 * 9;
  uVar74 = (ulong)(uint)((int)lVar1 * 2);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 10)));
  auVar255._16_16_ = auVar289;
  auVar255._0_16_ = auVar103;
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar72 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar72 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar255);
  auVar273._16_16_ = auVar289;
  auVar273._0_16_ = auVar103;
  auVar20 = vcvtdq2ps_avx(auVar273);
  uVar74 = (ulong)(uint)((int)lVar76 << 2);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 10)));
  auVar281._16_16_ = auVar289;
  auVar281._0_16_ = auVar103;
  auVar21 = vcvtdq2ps_avx(auVar281);
  auVar103 = vshufps_avx(auVar190,auVar190,0);
  auVar289 = vshufps_avx(auVar190,auVar190,0x55);
  auVar205 = vshufps_avx(auVar190,auVar190,0xaa);
  fVar189 = auVar205._0_4_;
  fVar208 = auVar205._4_4_;
  fVar209 = auVar205._8_4_;
  fVar210 = auVar205._12_4_;
  fVar211 = auVar289._0_4_;
  fVar212 = auVar289._4_4_;
  fVar213 = auVar289._8_4_;
  fVar138 = auVar289._12_4_;
  fVar162 = auVar103._0_4_;
  fVar163 = auVar103._4_4_;
  fVar164 = auVar103._8_4_;
  fVar165 = auVar103._12_4_;
  auVar303._0_4_ = fVar162 * auVar84._0_4_ + fVar211 * auVar14._0_4_ + fVar189 * auVar15._0_4_;
  auVar303._4_4_ = fVar163 * auVar84._4_4_ + fVar212 * auVar14._4_4_ + fVar208 * auVar15._4_4_;
  auVar303._8_4_ = fVar164 * auVar84._8_4_ + fVar213 * auVar14._8_4_ + fVar209 * auVar15._8_4_;
  auVar303._12_4_ = fVar165 * auVar84._12_4_ + fVar138 * auVar14._12_4_ + fVar210 * auVar15._12_4_;
  auVar303._16_4_ = fVar162 * auVar84._16_4_ + fVar211 * auVar14._16_4_ + fVar189 * auVar15._16_4_;
  auVar303._20_4_ = fVar163 * auVar84._20_4_ + fVar212 * auVar14._20_4_ + fVar208 * auVar15._20_4_;
  auVar303._24_4_ = fVar164 * auVar84._24_4_ + fVar213 * auVar14._24_4_ + fVar209 * auVar15._24_4_;
  auVar303._28_4_ = fVar138 + in_register_000015dc + in_register_0000151c;
  auVar295._0_4_ = fVar162 * auVar16._0_4_ + fVar211 * auVar17._0_4_ + fVar189 * auVar18._0_4_;
  auVar295._4_4_ = fVar163 * auVar16._4_4_ + fVar212 * auVar17._4_4_ + fVar208 * auVar18._4_4_;
  auVar295._8_4_ = fVar164 * auVar16._8_4_ + fVar213 * auVar17._8_4_ + fVar209 * auVar18._8_4_;
  auVar295._12_4_ = fVar165 * auVar16._12_4_ + fVar138 * auVar17._12_4_ + fVar210 * auVar18._12_4_;
  auVar295._16_4_ = fVar162 * auVar16._16_4_ + fVar211 * auVar17._16_4_ + fVar189 * auVar18._16_4_;
  auVar295._20_4_ = fVar163 * auVar16._20_4_ + fVar212 * auVar17._20_4_ + fVar208 * auVar18._20_4_;
  auVar295._24_4_ = fVar164 * auVar16._24_4_ + fVar213 * auVar17._24_4_ + fVar209 * auVar18._24_4_;
  auVar295._28_4_ = fVar138 + in_register_000015dc + in_register_0000159c;
  auVar207._0_4_ = fVar162 * auVar19._0_4_ + fVar211 * auVar20._0_4_ + auVar21._0_4_ * fVar189;
  auVar207._4_4_ = fVar163 * auVar19._4_4_ + fVar212 * auVar20._4_4_ + auVar21._4_4_ * fVar208;
  auVar207._8_4_ = fVar164 * auVar19._8_4_ + fVar213 * auVar20._8_4_ + auVar21._8_4_ * fVar209;
  auVar207._12_4_ = fVar165 * auVar19._12_4_ + fVar138 * auVar20._12_4_ + auVar21._12_4_ * fVar210;
  auVar207._16_4_ = fVar162 * auVar19._16_4_ + fVar211 * auVar20._16_4_ + auVar21._16_4_ * fVar189;
  auVar207._20_4_ = fVar163 * auVar19._20_4_ + fVar212 * auVar20._20_4_ + auVar21._20_4_ * fVar208;
  auVar207._24_4_ = fVar164 * auVar19._24_4_ + fVar213 * auVar20._24_4_ + auVar21._24_4_ * fVar209;
  auVar207._28_4_ = fVar165 + fVar138 + fVar210;
  auVar103 = vshufps_avx(auVar93,auVar93,0);
  auVar289 = vshufps_avx(auVar93,auVar93,0x55);
  auVar205 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar208 = auVar205._0_4_;
  fVar209 = auVar205._4_4_;
  fVar210 = auVar205._8_4_;
  fVar211 = auVar205._12_4_;
  fVar163 = auVar289._0_4_;
  fVar164 = auVar289._4_4_;
  fVar165 = auVar289._8_4_;
  fVar166 = auVar289._12_4_;
  fVar212 = auVar103._0_4_;
  fVar213 = auVar103._4_4_;
  fVar138 = auVar103._8_4_;
  fVar162 = auVar103._12_4_;
  fVar189 = auVar84._28_4_;
  auVar225._0_4_ = fVar212 * auVar84._0_4_ + fVar163 * auVar14._0_4_ + fVar208 * auVar15._0_4_;
  auVar225._4_4_ = fVar213 * auVar84._4_4_ + fVar164 * auVar14._4_4_ + fVar209 * auVar15._4_4_;
  auVar225._8_4_ = fVar138 * auVar84._8_4_ + fVar165 * auVar14._8_4_ + fVar210 * auVar15._8_4_;
  auVar225._12_4_ = fVar162 * auVar84._12_4_ + fVar166 * auVar14._12_4_ + fVar211 * auVar15._12_4_;
  auVar225._16_4_ = fVar212 * auVar84._16_4_ + fVar163 * auVar14._16_4_ + fVar208 * auVar15._16_4_;
  auVar225._20_4_ = fVar213 * auVar84._20_4_ + fVar164 * auVar14._20_4_ + fVar209 * auVar15._20_4_;
  auVar225._24_4_ = fVar138 * auVar84._24_4_ + fVar165 * auVar14._24_4_ + fVar210 * auVar15._24_4_;
  auVar225._28_4_ = fVar189 + auVar14._28_4_ + auVar15._28_4_;
  auVar133._0_4_ = fVar212 * auVar16._0_4_ + fVar163 * auVar17._0_4_ + fVar208 * auVar18._0_4_;
  auVar133._4_4_ = fVar213 * auVar16._4_4_ + fVar164 * auVar17._4_4_ + fVar209 * auVar18._4_4_;
  auVar133._8_4_ = fVar138 * auVar16._8_4_ + fVar165 * auVar17._8_4_ + fVar210 * auVar18._8_4_;
  auVar133._12_4_ = fVar162 * auVar16._12_4_ + fVar166 * auVar17._12_4_ + fVar211 * auVar18._12_4_;
  auVar133._16_4_ = fVar212 * auVar16._16_4_ + fVar163 * auVar17._16_4_ + fVar208 * auVar18._16_4_;
  auVar133._20_4_ = fVar213 * auVar16._20_4_ + fVar164 * auVar17._20_4_ + fVar209 * auVar18._20_4_;
  auVar133._24_4_ = fVar138 * auVar16._24_4_ + fVar165 * auVar17._24_4_ + fVar210 * auVar18._24_4_;
  auVar133._28_4_ = fVar189 + auVar15._28_4_ + auVar18._28_4_;
  auVar113._0_4_ = fVar212 * auVar19._0_4_ + fVar163 * auVar20._0_4_ + auVar21._0_4_ * fVar208;
  auVar113._4_4_ = fVar213 * auVar19._4_4_ + fVar164 * auVar20._4_4_ + auVar21._4_4_ * fVar209;
  auVar113._8_4_ = fVar138 * auVar19._8_4_ + fVar165 * auVar20._8_4_ + auVar21._8_4_ * fVar210;
  auVar113._12_4_ = fVar162 * auVar19._12_4_ + fVar166 * auVar20._12_4_ + auVar21._12_4_ * fVar211;
  auVar113._16_4_ = fVar212 * auVar19._16_4_ + fVar163 * auVar20._16_4_ + auVar21._16_4_ * fVar208;
  auVar113._20_4_ = fVar213 * auVar19._20_4_ + fVar164 * auVar20._20_4_ + auVar21._20_4_ * fVar209;
  auVar113._24_4_ = fVar138 * auVar19._24_4_ + fVar165 * auVar20._24_4_ + auVar21._24_4_ * fVar210;
  auVar113._28_4_ = fVar189 + auVar17._28_4_ + fVar211;
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar155._16_4_ = 0x219392ef;
  auVar155._20_4_ = 0x219392ef;
  auVar155._24_4_ = 0x219392ef;
  auVar155._28_4_ = 0x219392ef;
  auVar84 = vandps_avx(auVar303,auVar85);
  auVar84 = vcmpps_avx(auVar84,auVar155,1);
  auVar14 = vblendvps_avx(auVar303,auVar155,auVar84);
  auVar84 = vandps_avx(auVar295,auVar85);
  auVar84 = vcmpps_avx(auVar84,auVar155,1);
  auVar15 = vblendvps_avx(auVar295,auVar155,auVar84);
  auVar84 = vandps_avx(auVar207,auVar85);
  auVar84 = vcmpps_avx(auVar84,auVar155,1);
  auVar84 = vblendvps_avx(auVar207,auVar155,auVar84);
  auVar16 = vrcpps_avx(auVar14);
  fVar189 = auVar16._0_4_;
  fVar208 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar208;
  auVar17._0_4_ = auVar14._0_4_ * fVar189;
  fVar209 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar209;
  fVar210 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar210;
  fVar211 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar211;
  fVar212 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar212;
  fVar213 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar213;
  auVar17._28_4_ = auVar14._28_4_;
  auVar256._8_4_ = 0x3f800000;
  auVar256._0_8_ = &DAT_3f8000003f800000;
  auVar256._12_4_ = 0x3f800000;
  auVar256._16_4_ = 0x3f800000;
  auVar256._20_4_ = 0x3f800000;
  auVar256._24_4_ = 0x3f800000;
  auVar256._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar256,auVar17);
  fVar189 = fVar189 + fVar189 * auVar17._0_4_;
  fVar208 = fVar208 + fVar208 * auVar17._4_4_;
  fVar209 = fVar209 + fVar209 * auVar17._8_4_;
  fVar210 = fVar210 + fVar210 * auVar17._12_4_;
  fVar211 = fVar211 + fVar211 * auVar17._16_4_;
  fVar212 = fVar212 + fVar212 * auVar17._20_4_;
  fVar213 = fVar213 + fVar213 * auVar17._24_4_;
  auVar14 = vrcpps_avx(auVar15);
  fVar138 = auVar14._0_4_;
  fVar162 = auVar14._4_4_;
  auVar18._4_4_ = fVar162 * auVar15._4_4_;
  auVar18._0_4_ = fVar138 * auVar15._0_4_;
  fVar163 = auVar14._8_4_;
  auVar18._8_4_ = fVar163 * auVar15._8_4_;
  fVar164 = auVar14._12_4_;
  auVar18._12_4_ = fVar164 * auVar15._12_4_;
  fVar165 = auVar14._16_4_;
  auVar18._16_4_ = fVar165 * auVar15._16_4_;
  fVar166 = auVar14._20_4_;
  auVar18._20_4_ = fVar166 * auVar15._20_4_;
  fVar167 = auVar14._24_4_;
  auVar18._24_4_ = fVar167 * auVar15._24_4_;
  auVar18._28_4_ = auVar17._28_4_;
  auVar14 = vsubps_avx(auVar256,auVar18);
  fVar138 = fVar138 + fVar138 * auVar14._0_4_;
  fVar162 = fVar162 + fVar162 * auVar14._4_4_;
  fVar163 = fVar163 + fVar163 * auVar14._8_4_;
  fVar164 = fVar164 + fVar164 * auVar14._12_4_;
  fVar165 = fVar165 + fVar165 * auVar14._16_4_;
  fVar166 = fVar166 + fVar166 * auVar14._20_4_;
  fVar167 = fVar167 + fVar167 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar84);
  fVar168 = auVar14._0_4_;
  fVar183 = auVar14._4_4_;
  auVar15._4_4_ = fVar183 * auVar84._4_4_;
  auVar15._0_4_ = fVar168 * auVar84._0_4_;
  fVar184 = auVar14._8_4_;
  auVar15._8_4_ = fVar184 * auVar84._8_4_;
  fVar185 = auVar14._12_4_;
  auVar15._12_4_ = fVar185 * auVar84._12_4_;
  fVar186 = auVar14._16_4_;
  auVar15._16_4_ = fVar186 * auVar84._16_4_;
  fVar187 = auVar14._20_4_;
  auVar15._20_4_ = fVar187 * auVar84._20_4_;
  fVar188 = auVar14._24_4_;
  auVar15._24_4_ = fVar188 * auVar84._24_4_;
  auVar15._28_4_ = auVar84._28_4_;
  auVar84 = vsubps_avx(auVar256,auVar15);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar103 = vpmovsxwd_avx(auVar103);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar72 * 7 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar289);
  fVar168 = fVar168 + fVar168 * auVar84._0_4_;
  fVar183 = fVar183 + fVar183 * auVar84._4_4_;
  fVar184 = fVar184 + fVar184 * auVar84._8_4_;
  fVar185 = fVar185 + fVar185 * auVar84._12_4_;
  fVar186 = fVar186 + fVar186 * auVar84._16_4_;
  fVar187 = fVar187 + fVar187 * auVar84._20_4_;
  fVar188 = fVar188 + fVar188 * auVar84._24_4_;
  auVar86._16_16_ = auVar289;
  auVar86._0_16_ = auVar103;
  auVar84 = vcvtdq2ps_avx(auVar86);
  auVar84 = vsubps_avx(auVar84,auVar225);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + lVar1 + 6);
  auVar103 = vpmovsxwd_avx(auVar205);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar1 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar6);
  auVar79._0_4_ = fVar189 * auVar84._0_4_;
  auVar79._4_4_ = fVar208 * auVar84._4_4_;
  auVar79._8_4_ = fVar209 * auVar84._8_4_;
  auVar79._12_4_ = fVar210 * auVar84._12_4_;
  auVar19._16_4_ = fVar211 * auVar84._16_4_;
  auVar19._0_16_ = auVar79;
  auVar19._20_4_ = fVar212 * auVar84._20_4_;
  auVar19._24_4_ = fVar213 * auVar84._24_4_;
  auVar19._28_4_ = auVar84._28_4_;
  auVar237._16_16_ = auVar289;
  auVar237._0_16_ = auVar103;
  auVar84 = vcvtdq2ps_avx(auVar237);
  auVar84 = vsubps_avx(auVar84,auVar225);
  lVar76 = (ulong)(byte)PVar9 * 0x10;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar76 + 6);
  auVar103 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar76 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar8);
  lVar76 = lVar76 + uVar72 * -2;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + lVar76 + 6);
  auVar205 = vpmovsxwd_avx(auVar150);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + lVar76 + 0xe);
  auVar6 = vpmovsxwd_avx(auVar102);
  auVar191._0_4_ = fVar189 * auVar84._0_4_;
  auVar191._4_4_ = fVar208 * auVar84._4_4_;
  auVar191._8_4_ = fVar209 * auVar84._8_4_;
  auVar191._12_4_ = fVar210 * auVar84._12_4_;
  auVar20._16_4_ = fVar211 * auVar84._16_4_;
  auVar20._0_16_ = auVar191;
  auVar20._20_4_ = fVar212 * auVar84._20_4_;
  auVar20._24_4_ = fVar213 * auVar84._24_4_;
  auVar20._28_4_ = auVar16._28_4_ + auVar17._28_4_;
  auVar226._16_16_ = auVar6;
  auVar226._0_16_ = auVar205;
  auVar84 = vcvtdq2ps_avx(auVar226);
  auVar84 = vsubps_avx(auVar84,auVar133);
  auVar214._0_4_ = fVar138 * auVar84._0_4_;
  auVar214._4_4_ = fVar162 * auVar84._4_4_;
  auVar214._8_4_ = fVar163 * auVar84._8_4_;
  auVar214._12_4_ = fVar164 * auVar84._12_4_;
  auVar16._16_4_ = fVar165 * auVar84._16_4_;
  auVar16._0_16_ = auVar214;
  auVar16._20_4_ = fVar166 * auVar84._20_4_;
  auVar16._24_4_ = fVar167 * auVar84._24_4_;
  auVar16._28_4_ = auVar84._28_4_;
  auVar238._16_16_ = auVar289;
  auVar238._0_16_ = auVar103;
  auVar84 = vcvtdq2ps_avx(auVar238);
  auVar84 = vsubps_avx(auVar84,auVar133);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar74 + uVar72 + 6);
  auVar103 = vpmovsxwd_avx(auVar149);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar74 + uVar72 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar82);
  auVar118._0_4_ = fVar138 * auVar84._0_4_;
  auVar118._4_4_ = fVar162 * auVar84._4_4_;
  auVar118._8_4_ = fVar163 * auVar84._8_4_;
  auVar118._12_4_ = fVar164 * auVar84._12_4_;
  auVar21._16_4_ = fVar165 * auVar84._16_4_;
  auVar21._0_16_ = auVar118;
  auVar21._20_4_ = fVar166 * auVar84._20_4_;
  auVar21._24_4_ = fVar167 * auVar84._24_4_;
  auVar21._28_4_ = auVar84._28_4_;
  auVar156._16_16_ = auVar289;
  auVar156._0_16_ = auVar103;
  auVar84 = vcvtdq2ps_avx(auVar156);
  auVar84 = vsubps_avx(auVar84,auVar113);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar103 = vpmovsxwd_avx(auVar124);
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 0xe);
  auVar289 = vpmovsxwd_avx(auVar262);
  auVar139._0_4_ = fVar168 * auVar84._0_4_;
  auVar139._4_4_ = fVar183 * auVar84._4_4_;
  auVar139._8_4_ = fVar184 * auVar84._8_4_;
  auVar139._12_4_ = fVar185 * auVar84._12_4_;
  auVar22._16_4_ = fVar186 * auVar84._16_4_;
  auVar22._0_16_ = auVar139;
  auVar22._20_4_ = fVar187 * auVar84._20_4_;
  auVar22._24_4_ = fVar188 * auVar84._24_4_;
  auVar22._28_4_ = auVar84._28_4_;
  auVar239._16_16_ = auVar289;
  auVar239._0_16_ = auVar103;
  auVar84 = vcvtdq2ps_avx(auVar239);
  auVar84 = vsubps_avx(auVar84,auVar113);
  auVar94._0_4_ = fVar168 * auVar84._0_4_;
  auVar94._4_4_ = fVar183 * auVar84._4_4_;
  auVar94._8_4_ = fVar184 * auVar84._8_4_;
  auVar94._12_4_ = fVar185 * auVar84._12_4_;
  auVar23._16_4_ = fVar186 * auVar84._16_4_;
  auVar23._0_16_ = auVar94;
  auVar23._20_4_ = fVar187 * auVar84._20_4_;
  auVar23._24_4_ = fVar188 * auVar84._24_4_;
  auVar23._28_4_ = auVar84._28_4_;
  auVar103 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar289 = vpminsd_avx(auVar79,auVar191);
  auVar282._16_16_ = auVar103;
  auVar282._0_16_ = auVar289;
  auVar103 = vpminsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar289 = vpminsd_avx(auVar214,auVar118);
  auVar296._16_16_ = auVar103;
  auVar296._0_16_ = auVar289;
  auVar84 = vmaxps_avx(auVar282,auVar296);
  auVar103 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar289 = vpminsd_avx(auVar139,auVar94);
  auVar323._16_16_ = auVar103;
  auVar323._0_16_ = auVar289;
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar334._4_4_ = uVar4;
  auVar334._0_4_ = uVar4;
  auVar334._8_4_ = uVar4;
  auVar334._12_4_ = uVar4;
  auVar334._16_4_ = uVar4;
  auVar334._20_4_ = uVar4;
  auVar334._24_4_ = uVar4;
  auVar334._28_4_ = uVar4;
  auVar14 = vmaxps_avx(auVar323,auVar334);
  auVar84 = vmaxps_avx(auVar84,auVar14);
  local_178._4_4_ = auVar84._4_4_ * 0.99999964;
  local_178._0_4_ = auVar84._0_4_ * 0.99999964;
  local_178._8_4_ = auVar84._8_4_ * 0.99999964;
  local_178._12_4_ = auVar84._12_4_ * 0.99999964;
  local_178._16_4_ = auVar84._16_4_ * 0.99999964;
  local_178._20_4_ = auVar84._20_4_ * 0.99999964;
  local_178._24_4_ = auVar84._24_4_ * 0.99999964;
  local_178._28_4_ = auVar84._28_4_;
  auVar103 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar289 = vpmaxsd_avx(auVar79,auVar191);
  auVar87._16_16_ = auVar103;
  auVar87._0_16_ = auVar289;
  auVar103 = vpmaxsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar289 = vpmaxsd_avx(auVar214,auVar118);
  auVar134._16_16_ = auVar103;
  auVar134._0_16_ = auVar289;
  auVar84 = vminps_avx(auVar87,auVar134);
  auVar103 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar289 = vpmaxsd_avx(auVar139,auVar94);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = uVar4;
  auVar157._0_4_ = uVar4;
  auVar157._8_4_ = uVar4;
  auVar157._12_4_ = uVar4;
  auVar157._16_4_ = uVar4;
  auVar157._20_4_ = uVar4;
  auVar157._24_4_ = uVar4;
  auVar157._28_4_ = uVar4;
  auVar114._16_16_ = auVar103;
  auVar114._0_16_ = auVar289;
  auVar14 = vminps_avx(auVar114,auVar157);
  auVar84 = vminps_avx(auVar84,auVar14);
  auVar14._4_4_ = auVar84._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar84._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar84._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar84._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar84._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar84._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar84._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar84._28_4_;
  auVar84 = vcmpps_avx(local_178,auVar14,2);
  auVar103 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar115._16_16_ = auVar103;
  auVar115._0_16_ = auVar103;
  auVar14 = vcvtdq2ps_avx(auVar115);
  auVar14 = vcmpps_avx(_DAT_02020f40,auVar14,1);
  auVar84 = vandps_avx(auVar84,auVar14);
  uVar68 = vmovmskps_avx(auVar84);
  local_5f9 = uVar68 != 0;
  if (uVar68 == 0) {
    return local_5f9;
  }
  uVar68 = uVar68 & 0xff;
  pLVar77 = pre->ray_space + k;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_248 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar335 = ZEXT1664((undefined1  [16])0x0);
  local_430 = pLVar77;
LAB_0113df88:
  lVar76 = 0;
  if (uVar68 != 0) {
    for (; (uVar68 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar71 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar71].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(prim + lVar76 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar11 + (long)pGVar10[1].intersectionFilterN * uVar72);
  fVar162 = *pfVar2;
  fVar163 = pfVar2[1];
  fVar164 = pfVar2[2];
  fVar165 = pfVar2[3];
  lVar1 = uVar72 + 1;
  auVar103 = *(undefined1 (*) [16])(lVar11 + (long)pGVar10[1].intersectionFilterN * lVar1);
  _Var12 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var12 + (long)pGVar10[2].userPtr * uVar72);
  fVar166 = *pfVar2;
  fVar167 = pfVar2[1];
  fVar168 = pfVar2[2];
  fVar183 = pfVar2[3];
  auVar289 = *(undefined1 (*) [16])(_Var12 + (long)pGVar10[2].userPtr * lVar1);
  pfVar2 = (float *)(pGVar10[2].intersectionFilterN + (long)pGVar10[2].pointQueryFunc * uVar72);
  pfVar3 = (float *)(pGVar10[2].intersectionFilterN + (long)pGVar10[2].pointQueryFunc * lVar1);
  auVar119._0_4_ = *pfVar3 * 0.33333334;
  auVar119._4_4_ = pfVar3[1] * 0.33333334;
  auVar119._8_4_ = pfVar3[2] * 0.33333334;
  auVar119._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)((long)pGVar10[3].userPtr + uVar72 * *(long *)&pGVar10[3].fnumTimeSegments);
  auVar205 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar205 = vinsertps_avx(auVar205,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar184 = fVar162 + *pfVar2 * 0.33333334;
  fVar185 = fVar163 + pfVar2[1] * 0.33333334;
  fVar186 = fVar164 + pfVar2[2] * 0.33333334;
  fVar187 = fVar165 + pfVar2[3] * 0.33333334;
  auVar6 = vsubps_avx(auVar103,auVar119);
  fVar188 = fVar166 + *pfVar3 * 0.33333334;
  fVar284 = fVar167 + pfVar3[1] * 0.33333334;
  fVar285 = fVar168 + pfVar3[2] * 0.33333334;
  fVar286 = fVar183 + pfVar3[3] * 0.33333334;
  pfVar2 = (float *)((long)pGVar10[3].userPtr + *(long *)&pGVar10[3].fnumTimeSegments * lVar1);
  auVar95._0_4_ = *pfVar2 * 0.33333334;
  auVar95._4_4_ = pfVar2[1] * 0.33333334;
  auVar95._8_4_ = pfVar2[2] * 0.33333334;
  auVar95._12_4_ = pfVar2[3] * 0.33333334;
  auVar7 = vsubps_avx(auVar289,auVar95);
  fVar189 = auVar103._0_4_;
  fVar209 = auVar103._4_4_;
  fVar211 = auVar103._8_4_;
  fVar330 = auVar335._8_4_;
  fVar213 = auVar103._12_4_;
  fVar336 = auVar335._12_4_;
  fVar287 = auVar6._0_4_ * 0.0;
  fVar297 = auVar6._4_4_ * 0.0;
  fVar298 = auVar6._8_4_ * fVar330;
  fVar299 = auVar6._12_4_ * fVar336;
  fVar208 = fVar287 + fVar189 * 0.0;
  fVar210 = fVar297 + fVar209 * 0.0;
  fVar212 = fVar298 + fVar330 * fVar211;
  fVar138 = fVar299 + fVar336 * fVar213;
  fVar300 = fVar184 * 0.0;
  fVar304 = fVar185 * 0.0;
  fVar306 = fVar186 * fVar330;
  fVar308 = fVar187 * fVar336;
  local_5c8._0_4_ = fVar162 + fVar300 + fVar208;
  local_5c8._4_4_ = fVar163 + fVar304 + fVar210;
  fStack_5c0 = fVar164 + fVar306 + fVar212;
  fStack_5bc = fVar165 + fVar308 + fVar138;
  auVar120._0_4_ = fVar184 * 3.0 + fVar208;
  auVar120._4_4_ = fVar185 * 3.0 + fVar210;
  auVar120._8_4_ = fVar186 * 3.0 + fVar212;
  auVar120._12_4_ = fVar187 * 3.0 + fVar138;
  auVar241._0_4_ = fVar162 * 3.0;
  auVar241._4_4_ = fVar163 * 3.0;
  auVar241._8_4_ = fVar164 * 3.0;
  auVar241._12_4_ = fVar165 * 3.0;
  auVar149 = vsubps_avx(auVar120,auVar241);
  fVar208 = auVar289._0_4_;
  fVar210 = auVar289._4_4_;
  fVar212 = auVar289._8_4_;
  fVar138 = auVar289._12_4_;
  fVar317 = auVar7._0_4_ * 0.0;
  fVar325 = auVar7._4_4_ * 0.0;
  fVar326 = fVar330 * auVar7._8_4_;
  fVar327 = fVar336 * auVar7._12_4_;
  fVar184 = fVar208 * 0.0 + fVar317;
  fVar185 = fVar210 * 0.0 + fVar325;
  fVar186 = fVar330 * fVar212 + fVar326;
  fVar187 = fVar336 * fVar138 + fVar327;
  fVar330 = fVar188 * 0.0;
  fVar336 = fVar284 * 0.0;
  fVar338 = fVar285 * 0.0;
  fVar340 = fVar286 * 0.0;
  auVar341._0_4_ = fVar330 + fVar184 + fVar166;
  auVar341._4_4_ = fVar336 + fVar185 + fVar167;
  auVar341._8_4_ = fVar338 + fVar186 + fVar168;
  auVar341._12_4_ = fVar340 + fVar187 + fVar183;
  auVar242._0_4_ = fVar188 * 3.0 + fVar184;
  auVar242._4_4_ = fVar284 * 3.0 + fVar185;
  auVar242._8_4_ = fVar285 * 3.0 + fVar186;
  auVar242._12_4_ = fVar286 * 3.0 + fVar187;
  auVar275._0_4_ = fVar166 * 3.0;
  auVar275._4_4_ = fVar167 * 3.0;
  auVar275._8_4_ = fVar168 * 3.0;
  auVar275._12_4_ = fVar183 * 3.0;
  auVar8 = vsubps_avx(auVar242,auVar275);
  auVar288._0_4_ = fVar162 * 0.0;
  auVar288._4_4_ = fVar163 * 0.0;
  auVar288._8_4_ = fVar164 * 0.0;
  auVar288._12_4_ = fVar165 * 0.0;
  auVar140._0_4_ = auVar288._0_4_ + fVar300 + fVar287 + fVar189;
  auVar140._4_4_ = auVar288._4_4_ + fVar304 + fVar297 + fVar209;
  auVar140._8_4_ = auVar288._8_4_ + fVar306 + fVar298 + fVar211;
  auVar140._12_4_ = auVar288._12_4_ + fVar308 + fVar299 + fVar213;
  auVar169._0_4_ = fVar189 * 3.0;
  auVar169._4_4_ = fVar209 * 3.0;
  auVar169._8_4_ = fVar211 * 3.0;
  auVar169._12_4_ = fVar213 * 3.0;
  auVar243._0_4_ = auVar6._0_4_ * 3.0;
  auVar243._4_4_ = auVar6._4_4_ * 3.0;
  auVar243._8_4_ = auVar6._8_4_ * 3.0;
  auVar243._12_4_ = auVar6._12_4_ * 3.0;
  auVar103 = vsubps_avx(auVar169,auVar243);
  auVar170._0_4_ = fVar300 + auVar103._0_4_;
  auVar170._4_4_ = fVar304 + auVar103._4_4_;
  auVar170._8_4_ = fVar306 + auVar103._8_4_;
  auVar170._12_4_ = fVar308 + auVar103._12_4_;
  auVar82 = vsubps_avx(auVar170,auVar288);
  auVar192._0_4_ = fVar166 * 0.0;
  auVar192._4_4_ = fVar167 * 0.0;
  auVar192._8_4_ = fVar168 * 0.0;
  auVar192._12_4_ = fVar183 * 0.0;
  auVar259._0_4_ = fVar330 + fVar317 + fVar208 + auVar192._0_4_;
  auVar259._4_4_ = fVar336 + fVar325 + fVar210 + auVar192._4_4_;
  auVar259._8_4_ = fVar338 + fVar326 + fVar212 + auVar192._8_4_;
  auVar259._12_4_ = fVar340 + fVar327 + fVar138 + auVar192._12_4_;
  auVar215._0_4_ = fVar208 * 3.0;
  auVar215._4_4_ = fVar210 * 3.0;
  auVar215._8_4_ = fVar212 * 3.0;
  auVar215._12_4_ = fVar138 * 3.0;
  auVar229._0_4_ = auVar7._0_4_ * 3.0;
  auVar229._4_4_ = auVar7._4_4_ * 3.0;
  auVar229._8_4_ = auVar7._8_4_ * 3.0;
  auVar229._12_4_ = auVar7._12_4_ * 3.0;
  auVar103 = vsubps_avx(auVar215,auVar229);
  auVar216._0_4_ = fVar330 + auVar103._0_4_;
  auVar216._4_4_ = fVar336 + auVar103._4_4_;
  auVar216._8_4_ = fVar338 + auVar103._8_4_;
  auVar216._12_4_ = fVar340 + auVar103._12_4_;
  auVar150 = vsubps_avx(auVar216,auVar192);
  auVar103 = vshufps_avx(auVar149,auVar149,0xc9);
  auVar289 = vshufps_avx(auVar341,auVar341,0xc9);
  fVar184 = auVar149._0_4_;
  auVar230._0_4_ = fVar184 * auVar289._0_4_;
  fVar186 = auVar149._4_4_;
  auVar230._4_4_ = fVar186 * auVar289._4_4_;
  fVar188 = auVar149._8_4_;
  auVar230._8_4_ = fVar188 * auVar289._8_4_;
  fVar285 = auVar149._12_4_;
  auVar230._12_4_ = fVar285 * auVar289._12_4_;
  auVar244._0_4_ = auVar341._0_4_ * auVar103._0_4_;
  auVar244._4_4_ = auVar341._4_4_ * auVar103._4_4_;
  auVar244._8_4_ = auVar341._8_4_ * auVar103._8_4_;
  auVar244._12_4_ = auVar341._12_4_ * auVar103._12_4_;
  auVar289 = vsubps_avx(auVar244,auVar230);
  auVar6 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar289 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar231._0_4_ = fVar184 * auVar289._0_4_;
  auVar231._4_4_ = fVar186 * auVar289._4_4_;
  auVar231._8_4_ = fVar188 * auVar289._8_4_;
  auVar231._12_4_ = fVar285 * auVar289._12_4_;
  auVar193._0_4_ = auVar8._0_4_ * auVar103._0_4_;
  auVar193._4_4_ = auVar8._4_4_ * auVar103._4_4_;
  auVar193._8_4_ = auVar8._8_4_ * auVar103._8_4_;
  auVar193._12_4_ = auVar8._12_4_ * auVar103._12_4_;
  auVar103 = vsubps_avx(auVar193,auVar231);
  auVar7 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar103 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar289 = vshufps_avx(auVar259,auVar259,0xc9);
  fVar287 = auVar82._0_4_;
  auVar194._0_4_ = fVar287 * auVar289._0_4_;
  fVar297 = auVar82._4_4_;
  auVar194._4_4_ = fVar297 * auVar289._4_4_;
  fVar298 = auVar82._8_4_;
  auVar194._8_4_ = fVar298 * auVar289._8_4_;
  fVar299 = auVar82._12_4_;
  auVar194._12_4_ = fVar299 * auVar289._12_4_;
  auVar260._0_4_ = auVar259._0_4_ * auVar103._0_4_;
  auVar260._4_4_ = auVar259._4_4_ * auVar103._4_4_;
  auVar260._8_4_ = auVar259._8_4_ * auVar103._8_4_;
  auVar260._12_4_ = auVar259._12_4_ * auVar103._12_4_;
  auVar289 = vsubps_avx(auVar260,auVar194);
  auVar8 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar289 = vshufps_avx(auVar150,auVar150,0xc9);
  auVar261._0_4_ = auVar289._0_4_ * fVar287;
  auVar261._4_4_ = auVar289._4_4_ * fVar297;
  auVar261._8_4_ = auVar289._8_4_ * fVar298;
  auVar261._12_4_ = auVar289._12_4_ * fVar299;
  auVar217._0_4_ = auVar103._0_4_ * auVar150._0_4_;
  auVar217._4_4_ = auVar103._4_4_ * auVar150._4_4_;
  auVar217._8_4_ = auVar103._8_4_ * auVar150._8_4_;
  auVar217._12_4_ = auVar103._12_4_ * auVar150._12_4_;
  auVar103 = vsubps_avx(auVar217,auVar261);
  auVar150 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar103 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar211 = auVar103._0_4_;
  auVar262 = ZEXT416((uint)fVar211);
  auVar289 = vrsqrtss_avx(auVar262,auVar262);
  fVar189 = auVar289._0_4_;
  auVar289 = vdpps_avx(auVar6,auVar7,0x7f);
  auVar102 = ZEXT416((uint)(fVar189 * 1.5 - fVar211 * 0.5 * fVar189 * fVar189 * fVar189));
  auVar102 = vshufps_avx(auVar102,auVar102,0);
  fVar189 = auVar6._0_4_ * auVar102._0_4_;
  fVar208 = auVar6._4_4_ * auVar102._4_4_;
  fVar209 = auVar6._8_4_ * auVar102._8_4_;
  fVar210 = auVar6._12_4_ * auVar102._12_4_;
  auVar103 = vshufps_avx(auVar103,auVar103,0);
  auVar276._0_4_ = auVar103._0_4_ * auVar7._0_4_;
  auVar276._4_4_ = auVar103._4_4_ * auVar7._4_4_;
  auVar276._8_4_ = auVar103._8_4_ * auVar7._8_4_;
  auVar276._12_4_ = auVar103._12_4_ * auVar7._12_4_;
  auVar103 = vshufps_avx(auVar289,auVar289,0);
  auVar245._0_4_ = auVar103._0_4_ * auVar6._0_4_;
  auVar245._4_4_ = auVar103._4_4_ * auVar6._4_4_;
  auVar245._8_4_ = auVar103._8_4_ * auVar6._8_4_;
  auVar245._12_4_ = auVar103._12_4_ * auVar6._12_4_;
  auVar124 = vsubps_avx(auVar276,auVar245);
  auVar103 = vrcpss_avx(auVar262,auVar262);
  auVar103 = ZEXT416((uint)(auVar103._0_4_ * (2.0 - fVar211 * auVar103._0_4_)));
  auVar6 = vshufps_avx(auVar103,auVar103,0);
  auVar103 = vdpps_avx(auVar8,auVar8,0x7f);
  fVar211 = auVar103._0_4_;
  auVar262 = ZEXT416((uint)fVar211);
  auVar289 = vrsqrtss_avx(auVar262,auVar262);
  fVar212 = auVar289._0_4_;
  auVar289 = ZEXT416((uint)(fVar212 * 1.5 - fVar211 * 0.5 * fVar212 * fVar212 * fVar212));
  auVar7 = vshufps_avx(auVar289,auVar289,0);
  fVar212 = auVar7._0_4_ * auVar8._0_4_;
  fVar213 = auVar7._4_4_ * auVar8._4_4_;
  fVar138 = auVar7._8_4_ * auVar8._8_4_;
  fVar162 = auVar7._12_4_ * auVar8._12_4_;
  auVar289 = vdpps_avx(auVar8,auVar150,0x7f);
  auVar103 = vshufps_avx(auVar103,auVar103,0);
  auVar232._0_4_ = auVar103._0_4_ * auVar150._0_4_;
  auVar232._4_4_ = auVar103._4_4_ * auVar150._4_4_;
  auVar232._8_4_ = auVar103._8_4_ * auVar150._8_4_;
  auVar232._12_4_ = auVar103._12_4_ * auVar150._12_4_;
  auVar103 = vshufps_avx(auVar289,auVar289,0);
  auVar195._0_4_ = auVar103._0_4_ * auVar8._0_4_;
  auVar195._4_4_ = auVar103._4_4_ * auVar8._4_4_;
  auVar195._8_4_ = auVar103._8_4_ * auVar8._8_4_;
  auVar195._12_4_ = auVar103._12_4_ * auVar8._12_4_;
  auVar150 = vsubps_avx(auVar232,auVar195);
  auVar103 = vrcpss_avx(auVar262,auVar262);
  auVar103 = ZEXT416((uint)((2.0 - fVar211 * auVar103._0_4_) * auVar103._0_4_));
  auVar103 = vshufps_avx(auVar103,auVar103,0);
  auVar289 = vshufps_avx(_local_5c8,_local_5c8,0xff);
  auVar263._0_4_ = auVar289._0_4_ * fVar189;
  auVar263._4_4_ = auVar289._4_4_ * fVar208;
  auVar263._8_4_ = auVar289._8_4_ * fVar209;
  auVar263._12_4_ = auVar289._12_4_ * fVar210;
  _local_3d8 = vsubps_avx(_local_5c8,auVar263);
  auVar8 = vshufps_avx(auVar149,auVar149,0xff);
  auVar218._0_4_ =
       auVar8._0_4_ * fVar189 + auVar102._0_4_ * auVar124._0_4_ * auVar6._0_4_ * auVar289._0_4_;
  auVar218._4_4_ =
       auVar8._4_4_ * fVar208 + auVar102._4_4_ * auVar124._4_4_ * auVar6._4_4_ * auVar289._4_4_;
  auVar218._8_4_ =
       auVar8._8_4_ * fVar209 + auVar102._8_4_ * auVar124._8_4_ * auVar6._8_4_ * auVar289._8_4_;
  auVar218._12_4_ =
       auVar8._12_4_ * fVar210 + auVar102._12_4_ * auVar124._12_4_ * auVar6._12_4_ * auVar289._12_4_
  ;
  auVar8 = vsubps_avx(auVar149,auVar218);
  local_3e8._0_4_ = auVar263._0_4_ + (float)local_5c8._0_4_;
  local_3e8._4_4_ = auVar263._4_4_ + (float)local_5c8._4_4_;
  fStack_3e0 = auVar263._8_4_ + fStack_5c0;
  fStack_3dc = auVar263._12_4_ + fStack_5bc;
  auVar289 = vshufps_avx(auVar140,auVar140,0xff);
  auVar121._0_4_ = fVar212 * auVar289._0_4_;
  auVar121._4_4_ = fVar213 * auVar289._4_4_;
  auVar121._8_4_ = fVar138 * auVar289._8_4_;
  auVar121._12_4_ = fVar162 * auVar289._12_4_;
  _local_3f8 = vsubps_avx(auVar140,auVar121);
  auVar6 = vshufps_avx(auVar82,auVar82,0xff);
  auVar96._0_4_ =
       fVar212 * auVar6._0_4_ + auVar289._0_4_ * auVar7._0_4_ * auVar150._0_4_ * auVar103._0_4_;
  auVar96._4_4_ =
       fVar213 * auVar6._4_4_ + auVar289._4_4_ * auVar7._4_4_ * auVar150._4_4_ * auVar103._4_4_;
  auVar96._8_4_ =
       fVar138 * auVar6._8_4_ + auVar289._8_4_ * auVar7._8_4_ * auVar150._8_4_ * auVar103._8_4_;
  auVar96._12_4_ =
       fVar162 * auVar6._12_4_ + auVar289._12_4_ * auVar7._12_4_ * auVar150._12_4_ * auVar103._12_4_
  ;
  auVar7 = vsubps_avx(auVar82,auVar96);
  fVar185 = auVar140._0_4_ + auVar121._0_4_;
  fVar187 = auVar140._4_4_ + auVar121._4_4_;
  fVar284 = auVar140._8_4_ + auVar121._8_4_;
  fVar286 = auVar140._12_4_ + auVar121._12_4_;
  local_408._0_4_ = local_3d8._0_4_ + auVar8._0_4_ * 0.33333334;
  local_408._4_4_ = local_3d8._4_4_ + auVar8._4_4_ * 0.33333334;
  fStack_400 = local_3d8._8_4_ + auVar8._8_4_ * 0.33333334;
  fStack_3fc = local_3d8._12_4_ + auVar8._12_4_ * 0.33333334;
  local_288 = vsubps_avx(_local_3d8,auVar205);
  auVar289 = vmovsldup_avx(local_288);
  auVar103 = vmovshdup_avx(local_288);
  auVar6 = vshufps_avx(local_288,local_288,0xaa);
  fVar189 = (pLVar77->vx).field_0.m128[0];
  fVar208 = (pLVar77->vx).field_0.m128[1];
  fVar209 = (pLVar77->vx).field_0.m128[2];
  fVar210 = (pLVar77->vx).field_0.m128[3];
  fVar211 = (pLVar77->vy).field_0.m128[0];
  fVar212 = (pLVar77->vy).field_0.m128[1];
  fVar213 = (pLVar77->vy).field_0.m128[2];
  fVar138 = (pLVar77->vy).field_0.m128[3];
  fVar162 = (pLVar77->vz).field_0.m128[0];
  fVar163 = (pLVar77->vz).field_0.m128[1];
  fVar164 = (pLVar77->vz).field_0.m128[2];
  fVar165 = (pLVar77->vz).field_0.m128[3];
  fVar166 = fVar189 * auVar289._0_4_ + auVar6._0_4_ * fVar162 + fVar211 * auVar103._0_4_;
  fVar168 = fVar208 * auVar289._4_4_ + auVar6._4_4_ * fVar163 + fVar212 * auVar103._4_4_;
  local_5c8._4_4_ = fVar168;
  local_5c8._0_4_ = fVar166;
  fStack_5c0 = fVar209 * auVar289._8_4_ + auVar6._8_4_ * fVar164 + fVar213 * auVar103._8_4_;
  fStack_5bc = fVar210 * auVar289._12_4_ + auVar6._12_4_ * fVar165 + fVar138 * auVar103._12_4_;
  local_298 = vsubps_avx(_local_408,auVar205);
  auVar6 = vshufps_avx(local_298,local_298,0xaa);
  auVar103 = vmovshdup_avx(local_298);
  auVar289 = vmovsldup_avx(local_298);
  fVar167 = auVar289._0_4_ * fVar189 + auVar103._0_4_ * fVar211 + fVar162 * auVar6._0_4_;
  fVar183 = auVar289._4_4_ * fVar208 + auVar103._4_4_ * fVar212 + fVar163 * auVar6._4_4_;
  local_588._4_4_ = fVar183;
  local_588._0_4_ = fVar167;
  fStack_580 = auVar289._8_4_ * fVar209 + auVar103._8_4_ * fVar213 + fVar164 * auVar6._8_4_;
  fStack_57c = auVar289._12_4_ * fVar210 + auVar103._12_4_ * fVar138 + fVar165 * auVar6._12_4_;
  auVar196._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar196._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar196._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar196._12_4_ = auVar7._12_4_ * 0.33333334;
  _local_418 = vsubps_avx(_local_3f8,auVar196);
  local_2a8 = vsubps_avx(_local_418,auVar205);
  auVar6 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar103 = vmovshdup_avx(local_2a8);
  auVar289 = vmovsldup_avx(local_2a8);
  auVar332._0_4_ = auVar289._0_4_ * fVar189 + auVar103._0_4_ * fVar211 + fVar162 * auVar6._0_4_;
  auVar332._4_4_ = auVar289._4_4_ * fVar208 + auVar103._4_4_ * fVar212 + fVar163 * auVar6._4_4_;
  auVar332._8_4_ = auVar289._8_4_ * fVar209 + auVar103._8_4_ * fVar213 + fVar164 * auVar6._8_4_;
  auVar332._12_4_ = auVar289._12_4_ * fVar210 + auVar103._12_4_ * fVar138 + fVar165 * auVar6._12_4_;
  local_2b8 = vsubps_avx(_local_3f8,auVar205);
  auVar6 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar103 = vmovshdup_avx(local_2b8);
  auVar289 = vmovsldup_avx(local_2b8);
  auVar318._0_4_ = auVar289._0_4_ * fVar189 + auVar103._0_4_ * fVar211 + auVar6._0_4_ * fVar162;
  auVar318._4_4_ = auVar289._4_4_ * fVar208 + auVar103._4_4_ * fVar212 + auVar6._4_4_ * fVar163;
  auVar318._8_4_ = auVar289._8_4_ * fVar209 + auVar103._8_4_ * fVar213 + auVar6._8_4_ * fVar164;
  auVar318._12_4_ = auVar289._12_4_ * fVar210 + auVar103._12_4_ * fVar138 + auVar6._12_4_ * fVar165;
  local_2c8 = vsubps_avx(_local_3e8,auVar205);
  auVar6 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar103 = vmovshdup_avx(local_2c8);
  auVar289 = vmovsldup_avx(local_2c8);
  auVar301._0_4_ = auVar289._0_4_ * fVar189 + auVar103._0_4_ * fVar211 + auVar6._0_4_ * fVar162;
  auVar301._4_4_ = auVar289._4_4_ * fVar208 + auVar103._4_4_ * fVar212 + auVar6._4_4_ * fVar163;
  auVar301._8_4_ = auVar289._8_4_ * fVar209 + auVar103._8_4_ * fVar213 + auVar6._8_4_ * fVar164;
  auVar301._12_4_ = auVar289._12_4_ * fVar210 + auVar103._12_4_ * fVar138 + auVar6._12_4_ * fVar165;
  local_428._0_4_ = (float)local_3e8._0_4_ + (fVar184 + auVar218._0_4_) * 0.33333334;
  local_428._4_4_ = (float)local_3e8._4_4_ + (fVar186 + auVar218._4_4_) * 0.33333334;
  fStack_420 = fStack_3e0 + (fVar188 + auVar218._8_4_) * 0.33333334;
  fStack_41c = fStack_3dc + (fVar285 + auVar218._12_4_) * 0.33333334;
  local_2d8 = vsubps_avx(_local_428,auVar205);
  auVar6 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar103 = vmovshdup_avx(local_2d8);
  auVar289 = vmovsldup_avx(local_2d8);
  auVar246._0_4_ = auVar289._0_4_ * fVar189 + auVar103._0_4_ * fVar211 + auVar6._0_4_ * fVar162;
  auVar246._4_4_ = auVar289._4_4_ * fVar208 + auVar103._4_4_ * fVar212 + auVar6._4_4_ * fVar163;
  auVar246._8_4_ = auVar289._8_4_ * fVar209 + auVar103._8_4_ * fVar213 + auVar6._8_4_ * fVar164;
  auVar246._12_4_ = auVar289._12_4_ * fVar210 + auVar103._12_4_ * fVar138 + auVar6._12_4_ * fVar165;
  auVar233._0_4_ = (fVar287 + auVar96._0_4_) * 0.33333334;
  auVar233._4_4_ = (fVar297 + auVar96._4_4_) * 0.33333334;
  auVar233._8_4_ = (fVar298 + auVar96._8_4_) * 0.33333334;
  auVar233._12_4_ = (fVar299 + auVar96._12_4_) * 0.33333334;
  auVar63._4_4_ = fVar187;
  auVar63._0_4_ = fVar185;
  auVar63._8_4_ = fVar284;
  auVar63._12_4_ = fVar286;
  _local_318 = vsubps_avx(auVar63,auVar233);
  local_2e8 = vsubps_avx(_local_318,auVar205);
  auVar6 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar103 = vmovshdup_avx(local_2e8);
  auVar289 = vmovsldup_avx(local_2e8);
  auVar97._0_4_ = auVar289._0_4_ * fVar189 + auVar103._0_4_ * fVar211 + fVar162 * auVar6._0_4_;
  auVar97._4_4_ = auVar289._4_4_ * fVar208 + auVar103._4_4_ * fVar212 + fVar163 * auVar6._4_4_;
  auVar97._8_4_ = auVar289._8_4_ * fVar209 + auVar103._8_4_ * fVar213 + fVar164 * auVar6._8_4_;
  auVar97._12_4_ = auVar289._12_4_ * fVar210 + auVar103._12_4_ * fVar138 + fVar165 * auVar6._12_4_;
  local_2f8 = vsubps_avx(auVar63,auVar205);
  auVar205 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar103 = vmovshdup_avx(local_2f8);
  auVar289 = vmovsldup_avx(local_2f8);
  auVar80._0_4_ = fVar189 * auVar289._0_4_ + fVar211 * auVar103._0_4_ + fVar162 * auVar205._0_4_;
  auVar80._4_4_ = fVar208 * auVar289._4_4_ + fVar212 * auVar103._4_4_ + fVar163 * auVar205._4_4_;
  auVar80._8_4_ = fVar209 * auVar289._8_4_ + fVar213 * auVar103._8_4_ + fVar164 * auVar205._8_4_;
  auVar80._12_4_ = fVar210 * auVar289._12_4_ + fVar138 * auVar103._12_4_ + fVar165 * auVar205._12_4_
  ;
  auVar6 = vmovlhps_avx(_local_5c8,auVar301);
  auVar7 = vmovlhps_avx(_local_588,auVar246);
  auVar8 = vmovlhps_avx(auVar332,auVar97);
  _local_3c8 = vmovlhps_avx(auVar318,auVar80);
  auVar103 = vminps_avx(auVar6,auVar7);
  auVar289 = vminps_avx(auVar8,_local_3c8);
  auVar205 = vminps_avx(auVar103,auVar289);
  auVar103 = vmaxps_avx(auVar6,auVar7);
  auVar289 = vmaxps_avx(auVar8,_local_3c8);
  auVar103 = vmaxps_avx(auVar103,auVar289);
  auVar289 = vshufpd_avx(auVar205,auVar205,3);
  auVar205 = vminps_avx(auVar205,auVar289);
  auVar289 = vshufpd_avx(auVar103,auVar103,3);
  auVar289 = vmaxps_avx(auVar103,auVar289);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar103 = vandps_avx(auVar205,auVar219);
  auVar289 = vandps_avx(auVar289,auVar219);
  auVar103 = vmaxps_avx(auVar103,auVar289);
  auVar289 = vmovshdup_avx(auVar103);
  auVar103 = vmaxss_avx(auVar289,auVar103);
  fVar208 = auVar103._0_4_ * 9.536743e-07;
  auVar103 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
  local_138._16_16_ = auVar103;
  local_138._0_16_ = auVar103;
  auVar81._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
  auVar81._8_4_ = auVar103._8_4_ ^ 0x80000000;
  auVar81._12_4_ = auVar103._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar81;
  local_158._0_16_ = auVar81;
  local_328 = vpshufd_avx(ZEXT416(uVar71),0);
  local_338 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar76 * 4 + 6)),0);
  bVar67 = false;
  uVar72 = 0;
  fVar189 = *(float *)(ray + k * 4 + 0x30);
  _local_258 = vsubps_avx(auVar7,auVar6);
  _local_268 = vsubps_avx(auVar8,auVar7);
  _local_278 = vsubps_avx(_local_3c8,auVar8);
  _local_348 = vsubps_avx(_local_3e8,_local_3d8);
  _local_358 = vsubps_avx(_local_428,_local_408);
  _local_368 = vsubps_avx(_local_318,_local_418);
  auVar64._4_4_ = fVar187;
  auVar64._0_4_ = fVar185;
  auVar64._8_4_ = fVar284;
  auVar64._12_4_ = fVar286;
  _local_378 = vsubps_avx(auVar64,_local_3f8);
  _local_5c8 = ZEXT816(0x3f80000000000000);
  local_308 = _local_5c8;
  do {
    auVar103 = vshufps_avx(_local_5c8,_local_5c8,0x50);
    auVar342._8_4_ = 0x3f800000;
    auVar342._0_8_ = &DAT_3f8000003f800000;
    auVar342._12_4_ = 0x3f800000;
    auVar345._16_4_ = 0x3f800000;
    auVar345._0_16_ = auVar342;
    auVar345._20_4_ = 0x3f800000;
    auVar345._24_4_ = 0x3f800000;
    auVar345._28_4_ = 0x3f800000;
    auVar289 = vsubps_avx(auVar342,auVar103);
    fVar209 = auVar103._0_4_;
    fVar211 = auVar103._4_4_;
    fVar213 = auVar103._8_4_;
    fVar162 = auVar103._12_4_;
    fVar210 = auVar289._0_4_;
    fVar212 = auVar289._4_4_;
    fVar138 = auVar289._8_4_;
    fVar163 = auVar289._12_4_;
    auVar122._0_4_ = auVar301._0_4_ * fVar209 + fVar166 * fVar210;
    auVar122._4_4_ = auVar301._4_4_ * fVar211 + fVar168 * fVar212;
    auVar122._8_4_ = auVar301._0_4_ * fVar213 + fVar166 * fVar138;
    auVar122._12_4_ = auVar301._4_4_ * fVar162 + fVar168 * fVar163;
    auVar98._0_4_ = auVar246._0_4_ * fVar209 + fVar167 * fVar210;
    auVar98._4_4_ = auVar246._4_4_ * fVar211 + fVar183 * fVar212;
    auVar98._8_4_ = auVar246._0_4_ * fVar213 + fVar167 * fVar138;
    auVar98._12_4_ = auVar246._4_4_ * fVar162 + fVar183 * fVar163;
    auVar171._0_4_ = auVar97._0_4_ * fVar209 + auVar332._0_4_ * fVar210;
    auVar171._4_4_ = auVar97._4_4_ * fVar211 + auVar332._4_4_ * fVar212;
    auVar171._8_4_ = auVar97._0_4_ * fVar213 + auVar332._0_4_ * fVar138;
    auVar171._12_4_ = auVar97._4_4_ * fVar162 + auVar332._4_4_ * fVar163;
    auVar141._0_4_ = auVar80._0_4_ * fVar209 + auVar318._0_4_ * fVar210;
    auVar141._4_4_ = auVar80._4_4_ * fVar211 + auVar318._4_4_ * fVar212;
    auVar141._8_4_ = auVar80._0_4_ * fVar213 + auVar318._0_4_ * fVar138;
    auVar141._12_4_ = auVar80._4_4_ * fVar162 + auVar318._4_4_ * fVar163;
    auVar103 = vmovshdup_avx(local_308);
    auVar289 = vshufps_avx(local_308,local_308,0);
    auVar257._16_16_ = auVar289;
    auVar257._0_16_ = auVar289;
    auVar205 = vshufps_avx(local_308,local_308,0x55);
    auVar89._16_16_ = auVar205;
    auVar89._0_16_ = auVar205;
    auVar84 = vsubps_avx(auVar89,auVar257);
    auVar205 = vshufps_avx(auVar122,auVar122,0);
    auVar150 = vshufps_avx(auVar122,auVar122,0x55);
    auVar102 = vshufps_avx(auVar98,auVar98,0);
    auVar149 = vshufps_avx(auVar98,auVar98,0x55);
    auVar82 = vshufps_avx(auVar171,auVar171,0);
    auVar124 = vshufps_avx(auVar171,auVar171,0x55);
    auVar262 = vshufps_avx(auVar141,auVar141,0);
    auVar79 = vshufps_avx(auVar141,auVar141,0x55);
    auVar103 = ZEXT416((uint)((auVar103._0_4_ - local_308._0_4_) * 0.04761905));
    auVar103 = vshufps_avx(auVar103,auVar103,0);
    auVar274._0_4_ = auVar289._0_4_ + auVar84._0_4_ * 0.0;
    auVar274._4_4_ = auVar289._4_4_ + auVar84._4_4_ * 0.14285715;
    auVar274._8_4_ = auVar289._8_4_ + auVar84._8_4_ * 0.2857143;
    auVar274._12_4_ = auVar289._12_4_ + auVar84._12_4_ * 0.42857146;
    auVar274._16_4_ = auVar289._0_4_ + auVar84._16_4_ * 0.5714286;
    auVar274._20_4_ = auVar289._4_4_ + auVar84._20_4_ * 0.71428573;
    auVar274._24_4_ = auVar289._8_4_ + auVar84._24_4_ * 0.8571429;
    auVar274._28_4_ = auVar289._12_4_ + auVar84._28_4_;
    auVar15 = vsubps_avx(auVar345,auVar274);
    fVar285 = auVar102._0_4_;
    fVar297 = auVar102._4_4_;
    fVar306 = auVar102._8_4_;
    fVar317 = auVar102._12_4_;
    fVar209 = auVar15._0_4_;
    fVar213 = auVar15._4_4_;
    fVar164 = auVar15._8_4_;
    fVar188 = auVar15._12_4_;
    fVar328 = auVar205._12_4_;
    fVar298 = auVar15._16_4_;
    fVar299 = auVar15._20_4_;
    fVar300 = auVar15._24_4_;
    fVar336 = auVar149._0_4_;
    fVar340 = auVar149._4_4_;
    fVar228 = auVar149._8_4_;
    fVar316 = auVar149._12_4_;
    local_588._0_4_ = auVar150._0_4_;
    local_588._4_4_ = auVar150._4_4_;
    fStack_580 = auVar150._8_4_;
    fStack_57c = auVar150._12_4_;
    fVar210 = auVar82._0_4_;
    fVar212 = auVar82._4_4_;
    fVar162 = auVar82._8_4_;
    fVar165 = auVar82._12_4_;
    fVar287 = auVar274._0_4_ * fVar210 + fVar285 * fVar209;
    fVar304 = auVar274._4_4_ * fVar212 + fVar297 * fVar213;
    fVar308 = auVar274._8_4_ * fVar162 + fVar306 * fVar164;
    fVar325 = auVar274._12_4_ * fVar165 + fVar317 * fVar188;
    fVar326 = auVar274._16_4_ * fVar210 + fVar285 * fVar298;
    fVar327 = auVar274._20_4_ * fVar212 + fVar297 * fVar299;
    fVar330 = auVar274._24_4_ * fVar162 + fVar306 * fVar300;
    fVar211 = auVar124._0_4_;
    fVar138 = auVar124._4_4_;
    fVar163 = auVar124._8_4_;
    fVar184 = auVar124._12_4_;
    fVar338 = auVar274._0_4_ * fVar211 + fVar336 * fVar209;
    fVar305 = auVar274._4_4_ * fVar138 + fVar340 * fVar213;
    fVar307 = auVar274._8_4_ * fVar163 + fVar228 * fVar164;
    fVar309 = auVar274._12_4_ * fVar184 + fVar316 * fVar188;
    fVar310 = auVar274._16_4_ * fVar211 + fVar336 * fVar298;
    fVar312 = auVar274._20_4_ * fVar138 + fVar340 * fVar299;
    fVar314 = auVar274._24_4_ * fVar163 + fVar228 * fVar300;
    auVar289 = vshufps_avx(auVar122,auVar122,0xaa);
    auVar150 = vshufps_avx(auVar122,auVar122,0xff);
    fVar186 = fVar165 + 0.0;
    auVar102 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar149 = vshufps_avx(auVar98,auVar98,0xff);
    auVar90._0_4_ =
         fVar209 * (fVar285 * auVar274._0_4_ + auVar205._0_4_ * fVar209) + auVar274._0_4_ * fVar287;
    auVar90._4_4_ =
         fVar213 * (fVar297 * auVar274._4_4_ + auVar205._4_4_ * fVar213) + auVar274._4_4_ * fVar304;
    auVar90._8_4_ =
         fVar164 * (fVar306 * auVar274._8_4_ + auVar205._8_4_ * fVar164) + auVar274._8_4_ * fVar308;
    auVar90._12_4_ =
         fVar188 * (fVar317 * auVar274._12_4_ + fVar328 * fVar188) + auVar274._12_4_ * fVar325;
    auVar90._16_4_ =
         fVar298 * (fVar285 * auVar274._16_4_ + auVar205._0_4_ * fVar298) +
         auVar274._16_4_ * fVar326;
    auVar90._20_4_ =
         fVar299 * (fVar297 * auVar274._20_4_ + auVar205._4_4_ * fVar299) +
         auVar274._20_4_ * fVar327;
    auVar90._24_4_ =
         fVar300 * (fVar306 * auVar274._24_4_ + auVar205._8_4_ * fVar300) +
         auVar274._24_4_ * fVar330;
    auVar90._28_4_ = fVar328 + 1.0 + fVar184;
    auVar158._0_4_ =
         fVar209 * (fVar336 * auVar274._0_4_ + fVar209 * (float)local_588._0_4_) +
         auVar274._0_4_ * fVar338;
    auVar158._4_4_ =
         fVar213 * (fVar340 * auVar274._4_4_ + fVar213 * (float)local_588._4_4_) +
         auVar274._4_4_ * fVar305;
    auVar158._8_4_ =
         fVar164 * (fVar228 * auVar274._8_4_ + fVar164 * fStack_580) + auVar274._8_4_ * fVar307;
    auVar158._12_4_ =
         fVar188 * (fVar316 * auVar274._12_4_ + fVar188 * fStack_57c) + auVar274._12_4_ * fVar309;
    auVar158._16_4_ =
         fVar298 * (fVar336 * auVar274._16_4_ + fVar298 * (float)local_588._0_4_) +
         auVar274._16_4_ * fVar310;
    auVar158._20_4_ =
         fVar299 * (fVar340 * auVar274._20_4_ + fVar299 * (float)local_588._4_4_) +
         auVar274._20_4_ * fVar312;
    auVar158._24_4_ =
         fVar300 * (fVar228 * auVar274._24_4_ + fVar300 * fStack_580) + auVar274._24_4_ * fVar314;
    auVar158._28_4_ = fVar328 + 1.0 + fVar184;
    auVar180._0_4_ =
         fVar209 * fVar287 + auVar274._0_4_ * (auVar262._0_4_ * auVar274._0_4_ + fVar209 * fVar210);
    auVar180._4_4_ =
         fVar213 * fVar304 + auVar274._4_4_ * (auVar262._4_4_ * auVar274._4_4_ + fVar213 * fVar212);
    auVar180._8_4_ =
         fVar164 * fVar308 + auVar274._8_4_ * (auVar262._8_4_ * auVar274._8_4_ + fVar164 * fVar162);
    auVar180._12_4_ =
         fVar188 * fVar325 +
         auVar274._12_4_ * (auVar262._12_4_ * auVar274._12_4_ + fVar188 * fVar165);
    auVar180._16_4_ =
         fVar298 * fVar326 +
         auVar274._16_4_ * (auVar262._0_4_ * auVar274._16_4_ + fVar298 * fVar210);
    auVar180._20_4_ =
         fVar299 * fVar327 +
         auVar274._20_4_ * (auVar262._4_4_ * auVar274._20_4_ + fVar299 * fVar212);
    auVar180._24_4_ =
         fVar300 * fVar330 +
         auVar274._24_4_ * (auVar262._8_4_ * auVar274._24_4_ + fVar300 * fVar162);
    auVar180._28_4_ = fVar184 + fVar186;
    auVar283._0_4_ =
         fVar209 * fVar338 + auVar274._0_4_ * (auVar79._0_4_ * auVar274._0_4_ + fVar209 * fVar211);
    auVar283._4_4_ =
         fVar213 * fVar305 + auVar274._4_4_ * (auVar79._4_4_ * auVar274._4_4_ + fVar213 * fVar138);
    auVar283._8_4_ =
         fVar164 * fVar307 + auVar274._8_4_ * (auVar79._8_4_ * auVar274._8_4_ + fVar164 * fVar163);
    auVar283._12_4_ =
         fVar188 * fVar309 +
         auVar274._12_4_ * (auVar79._12_4_ * auVar274._12_4_ + fVar188 * fVar184);
    auVar283._16_4_ =
         fVar298 * fVar310 + auVar274._16_4_ * (auVar79._0_4_ * auVar274._16_4_ + fVar298 * fVar211)
    ;
    auVar283._20_4_ =
         fVar299 * fVar312 + auVar274._20_4_ * (auVar79._4_4_ * auVar274._20_4_ + fVar299 * fVar138)
    ;
    auVar283._24_4_ =
         fVar300 * fVar314 + auVar274._24_4_ * (auVar79._8_4_ * auVar274._24_4_ + fVar300 * fVar163)
    ;
    auVar283._28_4_ = fVar186 + fVar184 + 0.0;
    local_78._0_4_ = fVar209 * auVar90._0_4_ + auVar274._0_4_ * auVar180._0_4_;
    local_78._4_4_ = fVar213 * auVar90._4_4_ + auVar274._4_4_ * auVar180._4_4_;
    local_78._8_4_ = fVar164 * auVar90._8_4_ + auVar274._8_4_ * auVar180._8_4_;
    local_78._12_4_ = fVar188 * auVar90._12_4_ + auVar274._12_4_ * auVar180._12_4_;
    local_78._16_4_ = fVar298 * auVar90._16_4_ + auVar274._16_4_ * auVar180._16_4_;
    local_78._20_4_ = fVar299 * auVar90._20_4_ + auVar274._20_4_ * auVar180._20_4_;
    local_78._24_4_ = fVar300 * auVar90._24_4_ + auVar274._24_4_ * auVar180._24_4_;
    local_78._28_4_ = fVar328 + fVar317 + fVar184 + 0.0;
    local_98._0_4_ = fVar209 * auVar158._0_4_ + auVar274._0_4_ * auVar283._0_4_;
    local_98._4_4_ = fVar213 * auVar158._4_4_ + auVar274._4_4_ * auVar283._4_4_;
    local_98._8_4_ = fVar164 * auVar158._8_4_ + auVar274._8_4_ * auVar283._8_4_;
    local_98._12_4_ = fVar188 * auVar158._12_4_ + auVar274._12_4_ * auVar283._12_4_;
    local_98._16_4_ = fVar298 * auVar158._16_4_ + auVar274._16_4_ * auVar283._16_4_;
    local_98._20_4_ = fVar299 * auVar158._20_4_ + auVar274._20_4_ * auVar283._20_4_;
    local_98._24_4_ = fVar300 * auVar158._24_4_ + auVar274._24_4_ * auVar283._24_4_;
    local_98._28_4_ = fVar328 + fVar317 + fVar186;
    auVar16 = vsubps_avx(auVar180,auVar90);
    auVar84 = vsubps_avx(auVar283,auVar158);
    local_5a8 = auVar103._0_4_;
    fStack_5a4 = auVar103._4_4_;
    fStack_5a0 = auVar103._8_4_;
    fStack_59c = auVar103._12_4_;
    local_d8 = local_5a8 * auVar16._0_4_ * 3.0;
    fStack_d4 = fStack_5a4 * auVar16._4_4_ * 3.0;
    auVar24._4_4_ = fStack_d4;
    auVar24._0_4_ = local_d8;
    fStack_d0 = fStack_5a0 * auVar16._8_4_ * 3.0;
    auVar24._8_4_ = fStack_d0;
    fStack_cc = fStack_59c * auVar16._12_4_ * 3.0;
    auVar24._12_4_ = fStack_cc;
    fStack_c8 = local_5a8 * auVar16._16_4_ * 3.0;
    auVar24._16_4_ = fStack_c8;
    fStack_c4 = fStack_5a4 * auVar16._20_4_ * 3.0;
    auVar24._20_4_ = fStack_c4;
    fStack_c0 = fStack_5a0 * auVar16._24_4_ * 3.0;
    auVar24._24_4_ = fStack_c0;
    auVar24._28_4_ = auVar16._28_4_;
    fVar304 = local_5a8 * auVar84._0_4_ * 3.0;
    fVar306 = fStack_5a4 * auVar84._4_4_ * 3.0;
    auVar25._4_4_ = fVar306;
    auVar25._0_4_ = fVar304;
    fVar308 = fStack_5a0 * auVar84._8_4_ * 3.0;
    auVar25._8_4_ = fVar308;
    fVar317 = fStack_59c * auVar84._12_4_ * 3.0;
    auVar25._12_4_ = fVar317;
    fVar325 = local_5a8 * auVar84._16_4_ * 3.0;
    auVar25._16_4_ = fVar325;
    fVar326 = fStack_5a4 * auVar84._20_4_ * 3.0;
    auVar25._20_4_ = fVar326;
    fVar327 = fStack_5a0 * auVar84._24_4_ * 3.0;
    auVar25._24_4_ = fVar327;
    auVar25._28_4_ = auVar180._28_4_;
    auVar14 = vsubps_avx(local_78,auVar24);
    auVar84 = vperm2f128_avx(auVar14,auVar14,1);
    auVar84 = vshufps_avx(auVar84,auVar14,0x30);
    auVar84 = vshufps_avx(auVar14,auVar84,0x29);
    auVar17 = vsubps_avx(local_98,auVar25);
    auVar14 = vperm2f128_avx(auVar17,auVar17,1);
    auVar14 = vshufps_avx(auVar14,auVar17,0x30);
    auVar18 = vshufps_avx(auVar17,auVar14,0x29);
    fVar331 = auVar102._0_4_;
    fVar337 = auVar102._4_4_;
    fVar339 = auVar102._8_4_;
    fVar210 = auVar149._0_4_;
    fVar138 = auVar149._4_4_;
    fVar165 = auVar149._8_4_;
    fVar285 = auVar149._12_4_;
    fVar329 = auVar150._12_4_;
    auVar103 = vshufps_avx(auVar171,auVar171,0xaa);
    fVar211 = auVar103._0_4_;
    fVar162 = auVar103._4_4_;
    fVar184 = auVar103._8_4_;
    fVar287 = auVar103._12_4_;
    fVar309 = auVar274._0_4_ * fVar211 + fVar331 * fVar209;
    fVar310 = auVar274._4_4_ * fVar162 + fVar337 * fVar213;
    fVar312 = auVar274._8_4_ * fVar184 + fVar339 * fVar164;
    fVar314 = auVar274._12_4_ * fVar287 + auVar102._12_4_ * fVar188;
    fVar311 = auVar274._16_4_ * fVar211 + fVar331 * fVar298;
    fVar313 = auVar274._20_4_ * fVar162 + fVar337 * fVar299;
    fVar315 = auVar274._24_4_ * fVar184 + fVar339 * fVar300;
    fVar316 = fVar329 + fVar328 + fVar316;
    auVar103 = vshufps_avx(auVar171,auVar171,0xff);
    fVar212 = auVar103._0_4_;
    fVar163 = auVar103._4_4_;
    fVar186 = auVar103._8_4_;
    fVar297 = auVar103._12_4_;
    fVar330 = auVar274._0_4_ * fVar212 + fVar209 * fVar210;
    fVar336 = auVar274._4_4_ * fVar163 + fVar213 * fVar138;
    fVar338 = auVar274._8_4_ * fVar186 + fVar164 * fVar165;
    fVar340 = auVar274._12_4_ * fVar297 + fVar188 * fVar285;
    fVar305 = auVar274._16_4_ * fVar212 + fVar298 * fVar210;
    fVar228 = auVar274._20_4_ * fVar163 + fVar299 * fVar138;
    fVar307 = auVar274._24_4_ * fVar186 + fVar300 * fVar165;
    auVar103 = vshufps_avx(auVar141,auVar141,0xaa);
    auVar205 = vshufps_avx(auVar141,auVar141,0xff);
    fVar328 = auVar205._12_4_;
    auVar91._0_4_ =
         auVar274._0_4_ * fVar309 + fVar209 * (fVar331 * auVar274._0_4_ + auVar289._0_4_ * fVar209);
    auVar91._4_4_ =
         auVar274._4_4_ * fVar310 + fVar213 * (fVar337 * auVar274._4_4_ + auVar289._4_4_ * fVar213);
    auVar91._8_4_ =
         auVar274._8_4_ * fVar312 + fVar164 * (fVar339 * auVar274._8_4_ + auVar289._8_4_ * fVar164);
    auVar91._12_4_ =
         auVar274._12_4_ * fVar314 +
         fVar188 * (auVar102._12_4_ * auVar274._12_4_ + auVar289._12_4_ * fVar188);
    auVar91._16_4_ =
         auVar274._16_4_ * fVar311 +
         fVar298 * (fVar331 * auVar274._16_4_ + auVar289._0_4_ * fVar298);
    auVar91._20_4_ =
         auVar274._20_4_ * fVar313 +
         fVar299 * (fVar337 * auVar274._20_4_ + auVar289._4_4_ * fVar299);
    auVar91._24_4_ =
         auVar274._24_4_ * fVar315 +
         fVar300 * (fVar339 * auVar274._24_4_ + auVar289._8_4_ * fVar300);
    auVar91._28_4_ = fVar328 + auVar17._28_4_ + auVar14._28_4_;
    auVar324._0_4_ =
         auVar274._0_4_ * fVar330 + fVar209 * (auVar274._0_4_ * fVar210 + auVar150._0_4_ * fVar209);
    auVar324._4_4_ =
         auVar274._4_4_ * fVar336 + fVar213 * (auVar274._4_4_ * fVar138 + auVar150._4_4_ * fVar213);
    auVar324._8_4_ =
         auVar274._8_4_ * fVar338 + fVar164 * (auVar274._8_4_ * fVar165 + auVar150._8_4_ * fVar164);
    auVar324._12_4_ =
         auVar274._12_4_ * fVar340 + fVar188 * (auVar274._12_4_ * fVar285 + fVar329 * fVar188);
    auVar324._16_4_ =
         auVar274._16_4_ * fVar305 +
         fVar298 * (auVar274._16_4_ * fVar210 + auVar150._0_4_ * fVar298);
    auVar324._20_4_ =
         auVar274._20_4_ * fVar228 +
         fVar299 * (auVar274._20_4_ * fVar138 + auVar150._4_4_ * fVar299);
    auVar324._24_4_ =
         auVar274._24_4_ * fVar307 +
         fVar300 * (auVar274._24_4_ * fVar165 + auVar150._8_4_ * fVar300);
    auVar324._28_4_ = fVar328 + auVar14._28_4_ + auVar180._28_4_;
    auVar14 = vperm2f128_avx(local_78,local_78,1);
    auVar14 = vshufps_avx(auVar14,local_78,0x30);
    auVar19 = vshufps_avx(local_78,auVar14,0x29);
    auVar181._0_4_ =
         fVar209 * fVar309 + auVar274._0_4_ * (auVar103._0_4_ * auVar274._0_4_ + fVar209 * fVar211);
    auVar181._4_4_ =
         fVar213 * fVar310 + auVar274._4_4_ * (auVar103._4_4_ * auVar274._4_4_ + fVar213 * fVar162);
    auVar181._8_4_ =
         fVar164 * fVar312 + auVar274._8_4_ * (auVar103._8_4_ * auVar274._8_4_ + fVar164 * fVar184);
    auVar181._12_4_ =
         fVar188 * fVar314 +
         auVar274._12_4_ * (auVar103._12_4_ * auVar274._12_4_ + fVar188 * fVar287);
    auVar181._16_4_ =
         fVar298 * fVar311 +
         auVar274._16_4_ * (auVar103._0_4_ * auVar274._16_4_ + fVar298 * fVar211);
    auVar181._20_4_ =
         fVar299 * fVar313 +
         auVar274._20_4_ * (auVar103._4_4_ * auVar274._20_4_ + fVar299 * fVar162);
    auVar181._24_4_ =
         fVar300 * fVar315 +
         auVar274._24_4_ * (auVar103._8_4_ * auVar274._24_4_ + fVar300 * fVar184);
    auVar181._28_4_ = fVar316 + auVar103._12_4_ + fVar287;
    auVar227._0_4_ =
         fVar209 * fVar330 + auVar274._0_4_ * (auVar205._0_4_ * auVar274._0_4_ + fVar209 * fVar212);
    auVar227._4_4_ =
         fVar213 * fVar336 + auVar274._4_4_ * (auVar205._4_4_ * auVar274._4_4_ + fVar213 * fVar163);
    auVar227._8_4_ =
         fVar164 * fVar338 + auVar274._8_4_ * (auVar205._8_4_ * auVar274._8_4_ + fVar164 * fVar186);
    auVar227._12_4_ =
         fVar188 * fVar340 + auVar274._12_4_ * (fVar328 * auVar274._12_4_ + fVar188 * fVar297);
    auVar227._16_4_ =
         fVar298 * fVar305 +
         auVar274._16_4_ * (auVar205._0_4_ * auVar274._16_4_ + fVar298 * fVar212);
    auVar227._20_4_ =
         fVar299 * fVar228 +
         auVar274._20_4_ * (auVar205._4_4_ * auVar274._20_4_ + fVar299 * fVar163);
    auVar227._24_4_ =
         fVar300 * fVar307 +
         auVar274._24_4_ * (auVar205._8_4_ * auVar274._24_4_ + fVar300 * fVar186);
    auVar227._28_4_ = fVar329 + fVar285 + fVar328 + fVar297;
    auVar240._0_4_ = fVar209 * auVar91._0_4_ + auVar274._0_4_ * auVar181._0_4_;
    auVar240._4_4_ = fVar213 * auVar91._4_4_ + auVar274._4_4_ * auVar181._4_4_;
    auVar240._8_4_ = fVar164 * auVar91._8_4_ + auVar274._8_4_ * auVar181._8_4_;
    auVar240._12_4_ = fVar188 * auVar91._12_4_ + auVar274._12_4_ * auVar181._12_4_;
    auVar240._16_4_ = fVar298 * auVar91._16_4_ + auVar274._16_4_ * auVar181._16_4_;
    auVar240._20_4_ = fVar299 * auVar91._20_4_ + auVar274._20_4_ * auVar181._20_4_;
    auVar240._24_4_ = fVar300 * auVar91._24_4_ + auVar274._24_4_ * auVar181._24_4_;
    auVar240._28_4_ = fVar316 + fVar328 + fVar297;
    auVar258._0_4_ = fVar209 * auVar324._0_4_ + auVar274._0_4_ * auVar227._0_4_;
    auVar258._4_4_ = fVar213 * auVar324._4_4_ + auVar274._4_4_ * auVar227._4_4_;
    auVar258._8_4_ = fVar164 * auVar324._8_4_ + auVar274._8_4_ * auVar227._8_4_;
    auVar258._12_4_ = fVar188 * auVar324._12_4_ + auVar274._12_4_ * auVar227._12_4_;
    auVar258._16_4_ = fVar298 * auVar324._16_4_ + auVar274._16_4_ * auVar227._16_4_;
    auVar258._20_4_ = fVar299 * auVar324._20_4_ + auVar274._20_4_ * auVar227._20_4_;
    auVar258._24_4_ = fVar300 * auVar324._24_4_ + auVar274._24_4_ * auVar227._24_4_;
    auVar258._28_4_ = auVar15._28_4_ + auVar274._28_4_;
    auVar14 = vsubps_avx(auVar181,auVar91);
    auVar15 = vsubps_avx(auVar227,auVar324);
    local_f8 = local_5a8 * auVar14._0_4_ * 3.0;
    fStack_f4 = fStack_5a4 * auVar14._4_4_ * 3.0;
    auVar26._4_4_ = fStack_f4;
    auVar26._0_4_ = local_f8;
    fStack_f0 = fStack_5a0 * auVar14._8_4_ * 3.0;
    auVar26._8_4_ = fStack_f0;
    fStack_ec = fStack_59c * auVar14._12_4_ * 3.0;
    auVar26._12_4_ = fStack_ec;
    fStack_e8 = local_5a8 * auVar14._16_4_ * 3.0;
    auVar26._16_4_ = fStack_e8;
    fStack_e4 = fStack_5a4 * auVar14._20_4_ * 3.0;
    auVar26._20_4_ = fStack_e4;
    fStack_e0 = fStack_5a0 * auVar14._24_4_ * 3.0;
    auVar26._24_4_ = fStack_e0;
    auVar26._28_4_ = auVar227._28_4_;
    local_118 = local_5a8 * auVar15._0_4_ * 3.0;
    fStack_114 = fStack_5a4 * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fStack_114;
    auVar27._0_4_ = local_118;
    fStack_110 = fStack_5a0 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fStack_110;
    fStack_10c = fStack_59c * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fStack_10c;
    local_5a8 = local_5a8 * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = local_5a8;
    fStack_5a4 = fStack_5a4 * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fStack_5a4;
    fStack_5a0 = fStack_5a0 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fStack_5a0;
    auVar27._28_4_ = fStack_59c;
    auVar14 = vperm2f128_avx(auVar240,auVar240,1);
    auVar14 = vshufps_avx(auVar14,auVar240,0x30);
    auVar20 = vshufps_avx(auVar240,auVar14,0x29);
    auVar15 = vsubps_avx(auVar240,auVar26);
    auVar14 = vperm2f128_avx(auVar15,auVar15,1);
    auVar14 = vshufps_avx(auVar14,auVar15,0x30);
    auVar21 = vshufps_avx(auVar15,auVar14,0x29);
    auVar15 = vsubps_avx(auVar258,auVar27);
    auVar14 = vperm2f128_avx(auVar15,auVar15,1);
    auVar14 = vshufps_avx(auVar14,auVar15,0x30);
    auVar22 = vshufps_avx(auVar15,auVar14,0x29);
    auVar17 = vsubps_avx(auVar240,local_78);
    auVar85 = vsubps_avx(auVar20,auVar19);
    fVar209 = auVar85._0_4_ + auVar17._0_4_;
    fVar210 = auVar85._4_4_ + auVar17._4_4_;
    fVar211 = auVar85._8_4_ + auVar17._8_4_;
    fVar212 = auVar85._12_4_ + auVar17._12_4_;
    fVar213 = auVar85._16_4_ + auVar17._16_4_;
    fVar138 = auVar85._20_4_ + auVar17._20_4_;
    fVar162 = auVar85._24_4_ + auVar17._24_4_;
    auVar15 = vperm2f128_avx(local_98,local_98,1);
    auVar15 = vshufps_avx(auVar15,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar15,0x29);
    auVar15 = vperm2f128_avx(auVar258,auVar258,1);
    auVar15 = vshufps_avx(auVar15,auVar258,0x30);
    auVar23 = vshufps_avx(auVar258,auVar15,0x29);
    auVar15 = vsubps_avx(auVar258,local_98);
    auVar86 = vsubps_avx(auVar23,local_b8);
    fVar163 = auVar15._0_4_ + auVar86._0_4_;
    fVar164 = auVar15._4_4_ + auVar86._4_4_;
    fVar165 = auVar15._8_4_ + auVar86._8_4_;
    fVar184 = auVar15._12_4_ + auVar86._12_4_;
    fVar186 = auVar15._16_4_ + auVar86._16_4_;
    fVar188 = auVar15._20_4_ + auVar86._20_4_;
    fVar285 = auVar15._24_4_ + auVar86._24_4_;
    fVar287 = auVar15._28_4_;
    auVar28._4_4_ = local_98._4_4_ * fVar210;
    auVar28._0_4_ = local_98._0_4_ * fVar209;
    auVar28._8_4_ = local_98._8_4_ * fVar211;
    auVar28._12_4_ = local_98._12_4_ * fVar212;
    auVar28._16_4_ = local_98._16_4_ * fVar213;
    auVar28._20_4_ = local_98._20_4_ * fVar138;
    auVar28._24_4_ = local_98._24_4_ * fVar162;
    auVar28._28_4_ = fVar287;
    auVar29._4_4_ = fVar164 * local_78._4_4_;
    auVar29._0_4_ = fVar163 * local_78._0_4_;
    auVar29._8_4_ = fVar165 * local_78._8_4_;
    auVar29._12_4_ = fVar184 * local_78._12_4_;
    auVar29._16_4_ = fVar186 * local_78._16_4_;
    auVar29._20_4_ = fVar188 * local_78._20_4_;
    auVar29._24_4_ = fVar285 * local_78._24_4_;
    auVar29._28_4_ = auVar14._28_4_;
    auVar15 = vsubps_avx(auVar28,auVar29);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar16._28_4_;
    fVar304 = local_98._0_4_ + fVar304;
    fVar306 = local_98._4_4_ + fVar306;
    fVar308 = local_98._8_4_ + fVar308;
    fVar317 = local_98._12_4_ + fVar317;
    fVar325 = local_98._16_4_ + fVar325;
    fVar326 = local_98._20_4_ + fVar326;
    fVar327 = local_98._24_4_ + fVar327;
    auVar30._4_4_ = fVar306 * fVar210;
    auVar30._0_4_ = fVar304 * fVar209;
    auVar30._8_4_ = fVar308 * fVar211;
    auVar30._12_4_ = fVar317 * fVar212;
    auVar30._16_4_ = fVar325 * fVar213;
    auVar30._20_4_ = fVar326 * fVar138;
    auVar30._24_4_ = fVar327 * fVar162;
    auVar30._28_4_ = fVar287;
    auVar31._4_4_ = fVar164 * fStack_d4;
    auVar31._0_4_ = fVar163 * local_d8;
    auVar31._8_4_ = fVar165 * fStack_d0;
    auVar31._12_4_ = fVar184 * fStack_cc;
    auVar31._16_4_ = fVar186 * fStack_c8;
    auVar31._20_4_ = fVar188 * fStack_c4;
    auVar31._24_4_ = fVar285 * fStack_c0;
    auVar31._28_4_ = fStack_bc;
    auVar16 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar18._4_4_ * fVar210;
    auVar32._0_4_ = auVar18._0_4_ * fVar209;
    auVar32._8_4_ = auVar18._8_4_ * fVar211;
    auVar32._12_4_ = auVar18._12_4_ * fVar212;
    auVar32._16_4_ = auVar18._16_4_ * fVar213;
    auVar32._20_4_ = auVar18._20_4_ * fVar138;
    auVar32._24_4_ = auVar18._24_4_ * fVar162;
    auVar32._28_4_ = fVar287;
    local_588._0_4_ = auVar84._0_4_;
    local_588._4_4_ = auVar84._4_4_;
    fStack_580 = auVar84._8_4_;
    fStack_57c = auVar84._12_4_;
    fStack_578 = auVar84._16_4_;
    fStack_574 = auVar84._20_4_;
    fStack_570 = auVar84._24_4_;
    auVar33._4_4_ = fVar164 * (float)local_588._4_4_;
    auVar33._0_4_ = fVar163 * (float)local_588._0_4_;
    auVar33._8_4_ = fVar165 * fStack_580;
    auVar33._12_4_ = fVar184 * fStack_57c;
    auVar33._16_4_ = fVar186 * fStack_578;
    auVar33._20_4_ = fVar188 * fStack_574;
    auVar33._24_4_ = fVar285 * fStack_570;
    auVar33._28_4_ = 0x40400000;
    auVar87 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_b8._4_4_ * fVar210;
    auVar34._0_4_ = local_b8._0_4_ * fVar209;
    auVar34._8_4_ = local_b8._8_4_ * fVar211;
    auVar34._12_4_ = local_b8._12_4_ * fVar212;
    auVar34._16_4_ = local_b8._16_4_ * fVar213;
    auVar34._20_4_ = local_b8._20_4_ * fVar138;
    auVar34._24_4_ = local_b8._24_4_ * fVar162;
    auVar34._28_4_ = fVar287;
    auVar35._4_4_ = auVar19._4_4_ * fVar164;
    auVar35._0_4_ = auVar19._0_4_ * fVar163;
    auVar35._8_4_ = auVar19._8_4_ * fVar165;
    auVar35._12_4_ = auVar19._12_4_ * fVar184;
    auVar35._16_4_ = auVar19._16_4_ * fVar186;
    auVar35._20_4_ = auVar19._20_4_ * fVar188;
    auVar35._24_4_ = auVar19._24_4_ * fVar285;
    auVar35._28_4_ = local_b8._28_4_;
    auVar113 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar258._4_4_ * fVar210;
    auVar36._0_4_ = auVar258._0_4_ * fVar209;
    auVar36._8_4_ = auVar258._8_4_ * fVar211;
    auVar36._12_4_ = auVar258._12_4_ * fVar212;
    auVar36._16_4_ = auVar258._16_4_ * fVar213;
    auVar36._20_4_ = auVar258._20_4_ * fVar138;
    auVar36._24_4_ = auVar258._24_4_ * fVar162;
    auVar36._28_4_ = fVar287;
    auVar37._4_4_ = fVar164 * auVar240._4_4_;
    auVar37._0_4_ = fVar163 * auVar240._0_4_;
    auVar37._8_4_ = fVar165 * auVar240._8_4_;
    auVar37._12_4_ = fVar184 * auVar240._12_4_;
    auVar37._16_4_ = fVar186 * auVar240._16_4_;
    auVar37._20_4_ = fVar188 * auVar240._20_4_;
    auVar37._24_4_ = fVar285 * auVar240._24_4_;
    auVar37._28_4_ = auVar18._28_4_;
    auVar114 = vsubps_avx(auVar36,auVar37);
    local_f8 = auVar240._0_4_ + local_f8;
    fStack_f4 = auVar240._4_4_ + fStack_f4;
    fStack_f0 = auVar240._8_4_ + fStack_f0;
    fStack_ec = auVar240._12_4_ + fStack_ec;
    fStack_e8 = auVar240._16_4_ + fStack_e8;
    fStack_e4 = auVar240._20_4_ + fStack_e4;
    fStack_e0 = auVar240._24_4_ + fStack_e0;
    fStack_dc = auVar240._28_4_ + auVar227._28_4_;
    local_118 = auVar258._0_4_ + local_118;
    fStack_114 = auVar258._4_4_ + fStack_114;
    fStack_110 = auVar258._8_4_ + fStack_110;
    fStack_10c = auVar258._12_4_ + fStack_10c;
    fStack_108 = auVar258._16_4_ + local_5a8;
    fStack_104 = auVar258._20_4_ + fStack_5a4;
    fStack_100 = auVar258._24_4_ + fStack_5a0;
    fStack_fc = auVar258._28_4_ + fStack_59c;
    auVar38._4_4_ = fStack_114 * fVar210;
    auVar38._0_4_ = local_118 * fVar209;
    auVar38._8_4_ = fStack_110 * fVar211;
    auVar38._12_4_ = fStack_10c * fVar212;
    auVar38._16_4_ = fStack_108 * fVar213;
    auVar38._20_4_ = fStack_104 * fVar138;
    auVar38._24_4_ = fStack_100 * fVar162;
    auVar38._28_4_ = auVar258._28_4_ + fStack_59c;
    auVar39._4_4_ = fStack_f4 * fVar164;
    auVar39._0_4_ = local_f8 * fVar163;
    auVar39._8_4_ = fStack_f0 * fVar165;
    auVar39._12_4_ = fStack_ec * fVar184;
    auVar39._16_4_ = fStack_e8 * fVar186;
    auVar39._20_4_ = fStack_e4 * fVar188;
    auVar39._24_4_ = fStack_e0 * fVar285;
    auVar39._28_4_ = fStack_dc;
    auVar115 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = auVar22._4_4_ * fVar210;
    auVar40._0_4_ = auVar22._0_4_ * fVar209;
    auVar40._8_4_ = auVar22._8_4_ * fVar211;
    auVar40._12_4_ = auVar22._12_4_ * fVar212;
    auVar40._16_4_ = auVar22._16_4_ * fVar213;
    auVar40._20_4_ = auVar22._20_4_ * fVar138;
    auVar40._24_4_ = auVar22._24_4_ * fVar162;
    auVar40._28_4_ = fStack_dc;
    auVar41._4_4_ = fVar164 * auVar21._4_4_;
    auVar41._0_4_ = fVar163 * auVar21._0_4_;
    auVar41._8_4_ = fVar165 * auVar21._8_4_;
    auVar41._12_4_ = fVar184 * auVar21._12_4_;
    auVar41._16_4_ = fVar186 * auVar21._16_4_;
    auVar41._20_4_ = fVar188 * auVar21._20_4_;
    auVar41._24_4_ = fVar285 * auVar21._24_4_;
    auVar41._28_4_ = auVar21._28_4_;
    auVar132 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = auVar23._4_4_ * fVar210;
    auVar42._0_4_ = auVar23._0_4_ * fVar209;
    auVar42._8_4_ = auVar23._8_4_ * fVar211;
    auVar42._12_4_ = auVar23._12_4_ * fVar212;
    auVar42._16_4_ = auVar23._16_4_ * fVar213;
    auVar42._20_4_ = auVar23._20_4_ * fVar138;
    auVar42._24_4_ = auVar23._24_4_ * fVar162;
    auVar42._28_4_ = auVar85._28_4_ + auVar17._28_4_;
    auVar43._4_4_ = auVar20._4_4_ * fVar164;
    auVar43._0_4_ = auVar20._0_4_ * fVar163;
    auVar43._8_4_ = auVar20._8_4_ * fVar165;
    auVar43._12_4_ = auVar20._12_4_ * fVar184;
    auVar43._16_4_ = auVar20._16_4_ * fVar186;
    auVar43._20_4_ = auVar20._20_4_ * fVar188;
    auVar43._24_4_ = auVar20._24_4_ * fVar285;
    auVar43._28_4_ = fVar287 + auVar86._28_4_;
    auVar85 = vsubps_avx(auVar42,auVar43);
    auVar14 = vminps_avx(auVar15,auVar16);
    auVar84 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar87,auVar113);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar87,auVar113);
    auVar84 = vmaxps_avx(auVar84,auVar14);
    auVar16 = vminps_avx(auVar114,auVar115);
    auVar14 = vmaxps_avx(auVar114,auVar115);
    auVar17 = vminps_avx(auVar132,auVar85);
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar132,auVar85);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar84,auVar14);
    auVar84 = vcmpps_avx(auVar16,local_138,2);
    auVar14 = vcmpps_avx(auVar14,local_158,5);
    auVar84 = vandps_avx(auVar14,auVar84);
    auVar14 = local_248 & auVar84;
    uVar69 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(auVar19,local_78);
      auVar15 = vsubps_avx(auVar20,auVar240);
      fVar210 = auVar14._0_4_ + auVar15._0_4_;
      fVar211 = auVar14._4_4_ + auVar15._4_4_;
      fVar212 = auVar14._8_4_ + auVar15._8_4_;
      fVar213 = auVar14._12_4_ + auVar15._12_4_;
      fVar138 = auVar14._16_4_ + auVar15._16_4_;
      fVar162 = auVar14._20_4_ + auVar15._20_4_;
      fVar163 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(local_b8,local_98);
      auVar17 = vsubps_avx(auVar23,auVar258);
      fVar164 = auVar16._0_4_ + auVar17._0_4_;
      fVar165 = auVar16._4_4_ + auVar17._4_4_;
      fVar184 = auVar16._8_4_ + auVar17._8_4_;
      fVar186 = auVar16._12_4_ + auVar17._12_4_;
      fVar188 = auVar16._16_4_ + auVar17._16_4_;
      fVar285 = auVar16._20_4_ + auVar17._20_4_;
      fVar287 = auVar16._24_4_ + auVar17._24_4_;
      fVar209 = auVar17._28_4_;
      auVar44._4_4_ = local_98._4_4_ * fVar211;
      auVar44._0_4_ = local_98._0_4_ * fVar210;
      auVar44._8_4_ = local_98._8_4_ * fVar212;
      auVar44._12_4_ = local_98._12_4_ * fVar213;
      auVar44._16_4_ = local_98._16_4_ * fVar138;
      auVar44._20_4_ = local_98._20_4_ * fVar162;
      auVar44._24_4_ = local_98._24_4_ * fVar163;
      auVar44._28_4_ = local_98._28_4_;
      auVar45._4_4_ = local_78._4_4_ * fVar165;
      auVar45._0_4_ = local_78._0_4_ * fVar164;
      auVar45._8_4_ = local_78._8_4_ * fVar184;
      auVar45._12_4_ = local_78._12_4_ * fVar186;
      auVar45._16_4_ = local_78._16_4_ * fVar188;
      auVar45._20_4_ = local_78._20_4_ * fVar285;
      auVar45._24_4_ = local_78._24_4_ * fVar287;
      auVar45._28_4_ = local_78._28_4_;
      auVar17 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar306 * fVar211;
      auVar46._0_4_ = fVar304 * fVar210;
      auVar46._8_4_ = fVar308 * fVar212;
      auVar46._12_4_ = fVar317 * fVar213;
      auVar46._16_4_ = fVar325 * fVar138;
      auVar46._20_4_ = fVar326 * fVar162;
      auVar46._24_4_ = fVar327 * fVar163;
      auVar46._28_4_ = local_98._28_4_;
      auVar47._4_4_ = fVar165 * fStack_d4;
      auVar47._0_4_ = fVar164 * local_d8;
      auVar47._8_4_ = fVar184 * fStack_d0;
      auVar47._12_4_ = fVar186 * fStack_cc;
      auVar47._16_4_ = fVar188 * fStack_c8;
      auVar47._20_4_ = fVar285 * fStack_c4;
      auVar47._24_4_ = fVar287 * fStack_c0;
      auVar47._28_4_ = fVar209;
      auVar85 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar211 * auVar18._4_4_;
      auVar48._0_4_ = fVar210 * auVar18._0_4_;
      auVar48._8_4_ = fVar212 * auVar18._8_4_;
      auVar48._12_4_ = fVar213 * auVar18._12_4_;
      auVar48._16_4_ = fVar138 * auVar18._16_4_;
      auVar48._20_4_ = fVar162 * auVar18._20_4_;
      auVar48._24_4_ = fVar163 * auVar18._24_4_;
      auVar48._28_4_ = fVar209;
      auVar49._4_4_ = fVar165 * (float)local_588._4_4_;
      auVar49._0_4_ = fVar164 * (float)local_588._0_4_;
      auVar49._8_4_ = fVar184 * fStack_580;
      auVar49._12_4_ = fVar186 * fStack_57c;
      auVar49._16_4_ = fVar188 * fStack_578;
      auVar49._20_4_ = fVar285 * fStack_574;
      auVar49._24_4_ = fVar287 * fStack_570;
      auVar49._28_4_ = local_98._28_4_ + auVar180._28_4_;
      auVar18 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_b8._4_4_ * fVar211;
      auVar50._0_4_ = local_b8._0_4_ * fVar210;
      auVar50._8_4_ = local_b8._8_4_ * fVar212;
      auVar50._12_4_ = local_b8._12_4_ * fVar213;
      auVar50._16_4_ = local_b8._16_4_ * fVar138;
      auVar50._20_4_ = local_b8._20_4_ * fVar162;
      auVar50._24_4_ = local_b8._24_4_ * fVar163;
      auVar50._28_4_ = local_98._28_4_ + auVar180._28_4_;
      auVar51._4_4_ = auVar19._4_4_ * fVar165;
      auVar51._0_4_ = auVar19._0_4_ * fVar164;
      auVar51._8_4_ = auVar19._8_4_ * fVar184;
      auVar51._12_4_ = auVar19._12_4_ * fVar186;
      auVar51._16_4_ = auVar19._16_4_ * fVar188;
      auVar51._20_4_ = auVar19._20_4_ * fVar285;
      uVar4 = auVar19._28_4_;
      auVar51._24_4_ = auVar19._24_4_ * fVar287;
      auVar51._28_4_ = uVar4;
      auVar19 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar258._4_4_ * fVar211;
      auVar52._0_4_ = auVar258._0_4_ * fVar210;
      auVar52._8_4_ = auVar258._8_4_ * fVar212;
      auVar52._12_4_ = auVar258._12_4_ * fVar213;
      auVar52._16_4_ = auVar258._16_4_ * fVar138;
      auVar52._20_4_ = auVar258._20_4_ * fVar162;
      auVar52._24_4_ = auVar258._24_4_ * fVar163;
      auVar52._28_4_ = auVar258._28_4_;
      auVar53._4_4_ = auVar240._4_4_ * fVar165;
      auVar53._0_4_ = auVar240._0_4_ * fVar164;
      auVar53._8_4_ = auVar240._8_4_ * fVar184;
      auVar53._12_4_ = auVar240._12_4_ * fVar186;
      auVar53._16_4_ = auVar240._16_4_ * fVar188;
      auVar53._20_4_ = auVar240._20_4_ * fVar285;
      auVar53._24_4_ = auVar240._24_4_ * fVar287;
      auVar53._28_4_ = auVar240._28_4_;
      auVar86 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar211 * fStack_114;
      auVar54._0_4_ = fVar210 * local_118;
      auVar54._8_4_ = fVar212 * fStack_110;
      auVar54._12_4_ = fVar213 * fStack_10c;
      auVar54._16_4_ = fVar138 * fStack_108;
      auVar54._20_4_ = fVar162 * fStack_104;
      auVar54._24_4_ = fVar163 * fStack_100;
      auVar54._28_4_ = auVar258._28_4_;
      auVar55._4_4_ = fVar165 * fStack_f4;
      auVar55._0_4_ = fVar164 * local_f8;
      auVar55._8_4_ = fVar184 * fStack_f0;
      auVar55._12_4_ = fVar186 * fStack_ec;
      auVar55._16_4_ = fVar188 * fStack_e8;
      auVar55._20_4_ = fVar285 * fStack_e4;
      auVar55._24_4_ = fVar287 * fStack_e0;
      auVar55._28_4_ = uVar4;
      auVar87 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar211 * auVar22._4_4_;
      auVar56._0_4_ = fVar210 * auVar22._0_4_;
      auVar56._8_4_ = fVar212 * auVar22._8_4_;
      auVar56._12_4_ = fVar213 * auVar22._12_4_;
      auVar56._16_4_ = fVar138 * auVar22._16_4_;
      auVar56._20_4_ = fVar162 * auVar22._20_4_;
      auVar56._24_4_ = fVar163 * auVar22._24_4_;
      auVar56._28_4_ = uVar4;
      auVar57._4_4_ = fVar165 * auVar21._4_4_;
      auVar57._0_4_ = fVar164 * auVar21._0_4_;
      auVar57._8_4_ = fVar184 * auVar21._8_4_;
      auVar57._12_4_ = fVar186 * auVar21._12_4_;
      auVar57._16_4_ = fVar188 * auVar21._16_4_;
      auVar57._20_4_ = fVar285 * auVar21._20_4_;
      auVar57._24_4_ = fVar287 * auVar21._24_4_;
      auVar57._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = auVar23._4_4_ * fVar211;
      auVar58._0_4_ = auVar23._0_4_ * fVar210;
      auVar58._8_4_ = auVar23._8_4_ * fVar212;
      auVar58._12_4_ = auVar23._12_4_ * fVar213;
      auVar58._16_4_ = auVar23._16_4_ * fVar138;
      auVar58._20_4_ = auVar23._20_4_ * fVar162;
      auVar58._24_4_ = auVar23._24_4_ * fVar163;
      auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar59._4_4_ = auVar20._4_4_ * fVar165;
      auVar59._0_4_ = auVar20._0_4_ * fVar164;
      auVar59._8_4_ = auVar20._8_4_ * fVar184;
      auVar59._12_4_ = auVar20._12_4_ * fVar186;
      auVar59._16_4_ = auVar20._16_4_ * fVar188;
      auVar59._20_4_ = auVar20._20_4_ * fVar285;
      auVar59._24_4_ = auVar20._24_4_ * fVar287;
      auVar59._28_4_ = auVar16._28_4_ + fVar209;
      auVar20 = vsubps_avx(auVar58,auVar59);
      auVar15 = vminps_avx(auVar17,auVar85);
      auVar14 = vmaxps_avx(auVar17,auVar85);
      auVar16 = vminps_avx(auVar18,auVar19);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar18,auVar19);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar86,auVar87);
      auVar15 = vmaxps_avx(auVar86,auVar87);
      auVar18 = vminps_avx(auVar21,auVar20);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar20);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_138,2);
      auVar15 = vcmpps_avx(auVar15,local_158,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar84 = vandps_avx(auVar84,local_248);
      auVar15 = auVar84 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar14,auVar84);
        uVar69 = vmovmskps_avx(auVar84);
      }
    }
    if (uVar69 != 0) {
      auStack_3b8[uVar72] = uVar69;
      uVar5 = vmovlps_avx(local_308);
      *(undefined8 *)(afStack_228 + uVar72 * 2) = uVar5;
      uVar74 = vmovlps_avx(_local_5c8);
      auStack_58[uVar72] = uVar74;
      uVar72 = (ulong)((int)uVar72 + 1);
    }
    auVar335 = ZEXT864(0) << 0x20;
    do {
      if ((int)uVar72 == 0) {
        if (bVar67) {
          return local_5f9;
        }
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar92._4_4_ = uVar4;
        auVar92._0_4_ = uVar4;
        auVar92._8_4_ = uVar4;
        auVar92._12_4_ = uVar4;
        auVar92._16_4_ = uVar4;
        auVar92._20_4_ = uVar4;
        auVar92._24_4_ = uVar4;
        auVar92._28_4_ = uVar4;
        auVar84 = vcmpps_avx(local_178,auVar92,2);
        uVar71 = vmovmskps_avx(auVar84);
        uVar68 = uVar68 & uVar68 + 0xff & uVar71;
        local_5f9 = uVar68 != 0;
        if (!local_5f9) {
          return local_5f9;
        }
        goto LAB_0113df88;
      }
      uVar73 = (int)uVar72 - 1;
      uVar75 = (ulong)uVar73;
      uVar69 = auStack_3b8[uVar75];
      fVar209 = afStack_228[uVar75 * 2];
      fVar210 = afStack_228[uVar75 * 2 + 1];
      register0x00001548 = 0;
      local_5c8 = (undefined1  [8])auStack_58[uVar75];
      uVar74 = 0;
      if (uVar69 != 0) {
        for (; (uVar69 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
        }
      }
      uVar69 = uVar69 - 1 & uVar69;
      auStack_3b8[uVar75] = uVar69;
      if (uVar69 == 0) {
        uVar72 = (ulong)uVar73;
      }
      fVar212 = (float)(uVar74 + 1) * 0.14285715;
      fVar211 = (1.0 - (float)uVar74 * 0.14285715) * fVar209 + fVar210 * (float)uVar74 * 0.14285715;
      fVar209 = (1.0 - fVar212) * fVar209 + fVar210 * fVar212;
      fVar210 = fVar209 - fVar211;
      if (0.16666667 <= fVar210) break;
      auVar103 = vshufps_avx(_local_5c8,_local_5c8,0x50);
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = &DAT_3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar289 = vsubps_avx(auVar123,auVar103);
      fVar212 = auVar103._0_4_;
      fVar138 = auVar103._4_4_;
      fVar163 = auVar103._8_4_;
      fVar165 = auVar103._12_4_;
      fVar213 = auVar289._0_4_;
      fVar162 = auVar289._4_4_;
      fVar164 = auVar289._8_4_;
      fVar184 = auVar289._12_4_;
      auVar142._0_4_ = auVar301._0_4_ * fVar212 + fVar166 * fVar213;
      auVar142._4_4_ = auVar301._4_4_ * fVar138 + fVar168 * fVar162;
      auVar142._8_4_ = auVar301._0_4_ * fVar163 + fVar166 * fVar164;
      auVar142._12_4_ = auVar301._4_4_ * fVar165 + fVar168 * fVar184;
      auVar172._0_4_ = auVar246._0_4_ * fVar212 + fVar167 * fVar213;
      auVar172._4_4_ = auVar246._4_4_ * fVar138 + fVar183 * fVar162;
      auVar172._8_4_ = auVar246._0_4_ * fVar163 + fVar167 * fVar164;
      auVar172._12_4_ = auVar246._4_4_ * fVar165 + fVar183 * fVar184;
      auVar197._0_4_ = auVar97._0_4_ * fVar212 + fVar213 * auVar332._0_4_;
      auVar197._4_4_ = auVar97._4_4_ * fVar138 + fVar162 * auVar332._4_4_;
      auVar197._8_4_ = auVar97._0_4_ * fVar163 + fVar164 * auVar332._0_4_;
      auVar197._12_4_ = auVar97._4_4_ * fVar165 + fVar184 * auVar332._4_4_;
      auVar99._0_4_ = auVar80._0_4_ * fVar212 + auVar318._0_4_ * fVar213;
      auVar99._4_4_ = auVar80._4_4_ * fVar138 + auVar318._4_4_ * fVar162;
      auVar99._8_4_ = auVar80._0_4_ * fVar163 + auVar318._0_4_ * fVar164;
      auVar99._12_4_ = auVar80._4_4_ * fVar165 + auVar318._4_4_ * fVar184;
      auVar135._16_16_ = auVar142;
      auVar135._0_16_ = auVar142;
      auVar159._16_16_ = auVar172;
      auVar159._0_16_ = auVar172;
      auVar182._16_16_ = auVar197;
      auVar182._0_16_ = auVar197;
      auVar84 = vshufps_avx(ZEXT2032(CONCAT416(fVar209,ZEXT416((uint)fVar211))),
                            ZEXT2032(CONCAT416(fVar209,ZEXT416((uint)fVar211))),0);
      auVar14 = vsubps_avx(auVar159,auVar135);
      fVar212 = auVar84._0_4_;
      fVar213 = auVar84._4_4_;
      fVar138 = auVar84._8_4_;
      fVar162 = auVar84._12_4_;
      fVar163 = auVar84._16_4_;
      fVar164 = auVar84._20_4_;
      fVar165 = auVar84._24_4_;
      auVar136._0_4_ = auVar142._0_4_ + auVar14._0_4_ * fVar212;
      auVar136._4_4_ = auVar142._4_4_ + auVar14._4_4_ * fVar213;
      auVar136._8_4_ = auVar142._8_4_ + auVar14._8_4_ * fVar138;
      auVar136._12_4_ = auVar142._12_4_ + auVar14._12_4_ * fVar162;
      auVar136._16_4_ = auVar142._0_4_ + auVar14._16_4_ * fVar163;
      auVar136._20_4_ = auVar142._4_4_ + auVar14._20_4_ * fVar164;
      auVar136._24_4_ = auVar142._8_4_ + auVar14._24_4_ * fVar165;
      auVar136._28_4_ = auVar142._12_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar182,auVar159);
      auVar160._0_4_ = auVar172._0_4_ + auVar14._0_4_ * fVar212;
      auVar160._4_4_ = auVar172._4_4_ + auVar14._4_4_ * fVar213;
      auVar160._8_4_ = auVar172._8_4_ + auVar14._8_4_ * fVar138;
      auVar160._12_4_ = auVar172._12_4_ + auVar14._12_4_ * fVar162;
      auVar160._16_4_ = auVar172._0_4_ + auVar14._16_4_ * fVar163;
      auVar160._20_4_ = auVar172._4_4_ + auVar14._20_4_ * fVar164;
      auVar160._24_4_ = auVar172._8_4_ + auVar14._24_4_ * fVar165;
      auVar160._28_4_ = auVar172._12_4_ + auVar14._28_4_;
      auVar103 = vsubps_avx(auVar99,auVar197);
      auVar116._0_4_ = auVar197._0_4_ + auVar103._0_4_ * fVar212;
      auVar116._4_4_ = auVar197._4_4_ + auVar103._4_4_ * fVar213;
      auVar116._8_4_ = auVar197._8_4_ + auVar103._8_4_ * fVar138;
      auVar116._12_4_ = auVar197._12_4_ + auVar103._12_4_ * fVar162;
      auVar116._16_4_ = auVar197._0_4_ + auVar103._0_4_ * fVar163;
      auVar116._20_4_ = auVar197._4_4_ + auVar103._4_4_ * fVar164;
      auVar116._24_4_ = auVar197._8_4_ + auVar103._8_4_ * fVar165;
      auVar116._28_4_ = auVar197._12_4_ + auVar103._12_4_;
      auVar14 = vsubps_avx(auVar160,auVar136);
      auVar137._0_4_ = auVar136._0_4_ + fVar212 * auVar14._0_4_;
      auVar137._4_4_ = auVar136._4_4_ + fVar213 * auVar14._4_4_;
      auVar137._8_4_ = auVar136._8_4_ + fVar138 * auVar14._8_4_;
      auVar137._12_4_ = auVar136._12_4_ + fVar162 * auVar14._12_4_;
      auVar137._16_4_ = auVar136._16_4_ + fVar163 * auVar14._16_4_;
      auVar137._20_4_ = auVar136._20_4_ + fVar164 * auVar14._20_4_;
      auVar137._24_4_ = auVar136._24_4_ + fVar165 * auVar14._24_4_;
      auVar137._28_4_ = auVar136._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar116,auVar160);
      auVar117._0_4_ = auVar160._0_4_ + fVar212 * auVar14._0_4_;
      auVar117._4_4_ = auVar160._4_4_ + fVar213 * auVar14._4_4_;
      auVar117._8_4_ = auVar160._8_4_ + fVar138 * auVar14._8_4_;
      auVar117._12_4_ = auVar160._12_4_ + fVar162 * auVar14._12_4_;
      auVar117._16_4_ = auVar160._16_4_ + fVar163 * auVar14._16_4_;
      auVar117._20_4_ = auVar160._20_4_ + fVar164 * auVar14._20_4_;
      auVar117._24_4_ = auVar160._24_4_ + fVar165 * auVar14._24_4_;
      auVar117._28_4_ = auVar160._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar117,auVar137);
      auVar143._0_4_ = auVar137._0_4_ + fVar212 * auVar14._0_4_;
      auVar143._4_4_ = auVar137._4_4_ + fVar213 * auVar14._4_4_;
      auVar143._8_4_ = auVar137._8_4_ + fVar138 * auVar14._8_4_;
      auVar143._12_4_ = auVar137._12_4_ + fVar162 * auVar14._12_4_;
      auVar161._16_4_ = auVar137._16_4_ + fVar163 * auVar14._16_4_;
      auVar161._0_16_ = auVar143;
      auVar161._20_4_ = auVar137._20_4_ + fVar164 * auVar14._20_4_;
      auVar161._24_4_ = auVar137._24_4_ + fVar165 * auVar14._24_4_;
      auVar161._28_4_ = auVar137._28_4_ + auVar160._28_4_;
      fVar212 = auVar14._4_4_ * 3.0;
      auVar124 = auVar161._16_16_;
      auVar102 = vshufps_avx(ZEXT416((uint)(fVar210 * 0.33333334)),
                             ZEXT416((uint)(fVar210 * 0.33333334)),0);
      auVar264._0_4_ = auVar143._0_4_ + auVar102._0_4_ * auVar14._0_4_ * 3.0;
      auVar264._4_4_ = auVar143._4_4_ + auVar102._4_4_ * fVar212;
      auVar264._8_4_ = auVar143._8_4_ + auVar102._8_4_ * auVar14._8_4_ * 3.0;
      auVar264._12_4_ = auVar143._12_4_ + auVar102._12_4_ * auVar14._12_4_ * 3.0;
      auVar205 = vshufpd_avx(auVar143,auVar143,3);
      auVar150 = vshufpd_avx(auVar124,auVar124,3);
      auVar103 = vsubps_avx(auVar205,auVar143);
      auVar289 = vsubps_avx(auVar150,auVar124);
      auVar100._0_4_ = auVar103._0_4_ + auVar289._0_4_;
      auVar100._4_4_ = auVar103._4_4_ + auVar289._4_4_;
      auVar100._8_4_ = auVar103._8_4_ + auVar289._8_4_;
      auVar100._12_4_ = auVar103._12_4_ + auVar289._12_4_;
      auVar103 = vmovshdup_avx(auVar143);
      auVar289 = vmovshdup_avx(auVar264);
      auVar149 = vshufps_avx(auVar100,auVar100,0);
      auVar82 = vshufps_avx(auVar100,auVar100,0x55);
      fVar164 = auVar82._0_4_;
      fVar165 = auVar82._4_4_;
      fVar184 = auVar82._8_4_;
      fVar186 = auVar82._12_4_;
      fVar213 = auVar149._0_4_;
      fVar138 = auVar149._4_4_;
      fVar162 = auVar149._8_4_;
      fVar163 = auVar149._12_4_;
      auVar247._0_4_ = fVar213 * auVar143._0_4_ + fVar164 * auVar103._0_4_;
      auVar247._4_4_ = fVar138 * auVar143._4_4_ + fVar165 * auVar103._4_4_;
      auVar247._8_4_ = fVar162 * auVar143._8_4_ + fVar184 * auVar103._8_4_;
      auVar247._12_4_ = fVar163 * auVar143._12_4_ + fVar186 * auVar103._12_4_;
      auVar265._0_4_ = auVar264._0_4_ * fVar213 + fVar164 * auVar289._0_4_;
      auVar265._4_4_ = auVar264._4_4_ * fVar138 + fVar165 * auVar289._4_4_;
      auVar265._8_4_ = auVar264._8_4_ * fVar162 + fVar184 * auVar289._8_4_;
      auVar265._12_4_ = auVar264._12_4_ * fVar163 + fVar186 * auVar289._12_4_;
      auVar289 = vshufps_avx(auVar247,auVar247,0xe8);
      auVar149 = vshufps_avx(auVar265,auVar265,0xe8);
      auVar103 = vcmpps_avx(auVar289,auVar149,1);
      uVar69 = vextractps_avx(auVar103,0);
      auVar82 = auVar265;
      if ((uVar69 & 1) == 0) {
        auVar82 = auVar247;
      }
      auVar101._0_4_ = auVar102._0_4_ * auVar14._16_4_ * 3.0;
      auVar101._4_4_ = auVar102._4_4_ * fVar212;
      auVar101._8_4_ = auVar102._8_4_ * auVar14._24_4_ * 3.0;
      auVar101._12_4_ = auVar102._12_4_ * auVar84._28_4_;
      auVar79 = vsubps_avx(auVar124,auVar101);
      auVar102 = vmovshdup_avx(auVar79);
      auVar124 = vmovshdup_avx(auVar124);
      fVar212 = auVar79._0_4_;
      fVar188 = auVar79._4_4_;
      auVar343._0_4_ = fVar213 * fVar212 + fVar164 * auVar102._0_4_;
      auVar343._4_4_ = fVar138 * fVar188 + fVar165 * auVar102._4_4_;
      auVar343._8_4_ = fVar162 * auVar79._8_4_ + fVar184 * auVar102._8_4_;
      auVar343._12_4_ = fVar163 * auVar79._12_4_ + fVar186 * auVar102._12_4_;
      auVar319._0_4_ = fVar213 * auVar161._16_4_ + fVar164 * auVar124._0_4_;
      auVar319._4_4_ = fVar138 * auVar161._20_4_ + fVar165 * auVar124._4_4_;
      auVar319._8_4_ = fVar162 * auVar161._24_4_ + fVar184 * auVar124._8_4_;
      auVar319._12_4_ = fVar163 * auVar161._28_4_ + fVar186 * auVar124._12_4_;
      auVar124 = vshufps_avx(auVar343,auVar343,0xe8);
      auVar262 = vshufps_avx(auVar319,auVar319,0xe8);
      auVar102 = vcmpps_avx(auVar124,auVar262,1);
      uVar69 = vextractps_avx(auVar102,0);
      auVar93 = auVar319;
      if ((uVar69 & 1) == 0) {
        auVar93 = auVar343;
      }
      auVar82 = vmaxss_avx(auVar93,auVar82);
      auVar289 = vminps_avx(auVar289,auVar149);
      auVar149 = vminps_avx(auVar124,auVar262);
      auVar149 = vminps_avx(auVar289,auVar149);
      auVar103 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vblendps_avx(auVar103,auVar102,2);
      auVar102 = vpslld_avx(auVar103,0x1f);
      auVar103 = vshufpd_avx(auVar265,auVar265,1);
      auVar103 = vinsertps_avx(auVar103,auVar319,0x9c);
      auVar289 = vshufpd_avx(auVar247,auVar247,1);
      auVar289 = vinsertps_avx(auVar289,auVar343,0x9c);
      auVar103 = vblendvps_avx(auVar289,auVar103,auVar102);
      auVar289 = vmovshdup_avx(auVar103);
      auVar103 = vmaxss_avx(auVar289,auVar103);
      fVar162 = auVar149._0_4_;
      auVar289 = vmovshdup_avx(auVar149);
      fVar138 = auVar103._0_4_;
      fVar163 = auVar289._0_4_;
      fVar213 = auVar82._0_4_;
      if ((0.0001 <= fVar162) || (fVar138 <= -0.0001)) {
        if ((-0.0001 < fVar213 && fVar163 < 0.0001) ||
           ((fVar162 < 0.0001 && -0.0001 < fVar213 || (fVar163 < 0.0001 && -0.0001 < fVar138))))
        goto LAB_0113f17c;
LAB_0113fdd2:
        bVar60 = true;
        auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0113f17c:
        auVar335 = ZEXT864(0) << 0x20;
        auVar102 = vcmpps_avx(auVar149,ZEXT816(0) << 0x20,1);
        auVar289 = vcmpss_avx(auVar82,ZEXT416(0),1);
        auVar198._8_4_ = 0x3f800000;
        auVar198._0_8_ = &DAT_3f8000003f800000;
        auVar198._12_4_ = 0x3f800000;
        auVar266._8_4_ = 0xbf800000;
        auVar266._0_8_ = 0xbf800000bf800000;
        auVar266._12_4_ = 0xbf800000;
        auVar289 = vblendvps_avx(auVar198,auVar266,auVar289);
        auVar102 = vblendvps_avx(auVar198,auVar266,auVar102);
        auVar124 = vcmpss_avx(auVar289,auVar102,4);
        auVar124 = vpshufd_avx(ZEXT416(auVar124._0_4_ & 1),0x50);
        auVar124 = vpslld_avx(auVar124,0x1f);
        auVar124 = vpsrad_avx(auVar124,0x1f);
        auVar124 = vpandn_avx(auVar124,_DAT_02020eb0);
        auVar262 = vmovshdup_avx(auVar102);
        fVar164 = auVar262._0_4_;
        if ((auVar102._0_4_ != fVar164) || (NAN(auVar102._0_4_) || NAN(fVar164))) {
          if ((fVar163 != fVar162) || (NAN(fVar163) || NAN(fVar162))) {
            fVar162 = -fVar162 / (fVar163 - fVar162);
            auVar102 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar162) * 0.0 + fVar162)));
          }
          else {
            auVar102 = vcmpss_avx(auVar149,ZEXT416(0),0);
            auVar102 = vpshufd_avx(ZEXT416(auVar102._0_4_ & 1),0x50);
            auVar102 = vpslld_avx(auVar102,0x1f);
            auVar102 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar102);
          }
          auVar262 = vcmpps_avx(auVar124,auVar102,1);
          auVar149 = vblendps_avx(auVar124,auVar102,2);
          auVar102 = vblendps_avx(auVar102,auVar124,2);
          auVar124 = vblendvps_avx(auVar102,auVar149,auVar262);
        }
        auVar103 = vcmpss_avx(auVar103,ZEXT416(0),1);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = &DAT_3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar199._8_4_ = 0xbf800000;
        auVar199._0_8_ = 0xbf800000bf800000;
        auVar199._12_4_ = 0xbf800000;
        auVar103 = vblendvps_avx(auVar125,auVar199,auVar103);
        fVar162 = auVar103._0_4_;
        if ((auVar289._0_4_ != fVar162) || (NAN(auVar289._0_4_) || NAN(fVar162))) {
          if ((fVar138 != fVar213) || (NAN(fVar138) || NAN(fVar213))) {
            fVar213 = -fVar213 / (fVar138 - fVar213);
            auVar103 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar213) * 0.0 + fVar213)));
          }
          else {
            auVar103 = vcmpss_avx(auVar82,ZEXT416(0),0);
            auVar103 = vpshufd_avx(ZEXT416(auVar103._0_4_ & 1),0x50);
            auVar103 = vpslld_avx(auVar103,0x1f);
            auVar103 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar103);
          }
          auVar102 = vcmpps_avx(auVar124,auVar103,1);
          auVar289 = vblendps_avx(auVar124,auVar103,2);
          auVar103 = vblendps_avx(auVar103,auVar124,2);
          auVar124 = vblendvps_avx(auVar103,auVar289,auVar102);
        }
        if ((fVar164 != fVar162) || (NAN(fVar164) || NAN(fVar162))) {
          auVar104._8_4_ = 0x3f800000;
          auVar104._0_8_ = &DAT_3f8000003f800000;
          auVar104._12_4_ = 0x3f800000;
          auVar103 = vcmpps_avx(auVar124,auVar104,1);
          auVar289 = vinsertps_avx(auVar124,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar200._4_12_ = auVar124._4_12_;
          auVar200._0_4_ = 0x3f800000;
          auVar124 = vblendvps_avx(auVar200,auVar289,auVar103);
        }
        auVar103 = vcmpps_avx(auVar124,_DAT_01fec6f0,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar124._4_12_;
        auVar289 = vinsertps_avx(auVar124,ZEXT416(0x3f800000),0x10);
        auVar103 = vblendvps_avx(auVar289,auVar61 << 0x20,auVar103);
        auVar289 = vmovshdup_avx(auVar103);
        bVar60 = true;
        if (auVar103._0_4_ <= auVar289._0_4_) {
          auVar105._0_4_ = auVar103._0_4_ + -0.1;
          auVar105._4_4_ = auVar103._4_4_ + 0.1;
          auVar105._8_4_ = auVar103._8_4_ + 0.0;
          auVar105._12_4_ = auVar103._12_4_ + 0.0;
          auVar102 = vshufpd_avx(auVar264,auVar264,3);
          auVar144._8_8_ = 0x3f80000000000000;
          auVar144._0_8_ = 0x3f80000000000000;
          auVar103 = vcmpps_avx(auVar105,auVar144,1);
          auVar62._12_4_ = 0;
          auVar62._0_12_ = auVar105._4_12_;
          auVar289 = vinsertps_avx(auVar105,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar103 = vblendvps_avx(auVar289,auVar62 << 0x20,auVar103);
          auVar289 = vshufpd_avx(auVar79,auVar79,3);
          auVar149 = vshufps_avx(auVar103,auVar103,0x50);
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = &DAT_3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          auVar82 = vsubps_avx(auVar145,auVar149);
          local_4a8 = auVar205._0_4_;
          fStack_4a4 = auVar205._4_4_;
          fStack_4a0 = auVar205._8_4_;
          fStack_49c = auVar205._12_4_;
          fVar213 = auVar149._0_4_;
          fVar138 = auVar149._4_4_;
          fVar162 = auVar149._8_4_;
          fVar163 = auVar149._12_4_;
          local_558 = auVar150._0_4_;
          fStack_554 = auVar150._4_4_;
          fStack_550 = auVar150._8_4_;
          fStack_54c = auVar150._12_4_;
          fVar164 = auVar82._0_4_;
          fVar165 = auVar82._4_4_;
          fVar184 = auVar82._8_4_;
          fVar186 = auVar82._12_4_;
          auVar126._0_4_ = fVar213 * local_4a8 + fVar164 * auVar143._0_4_;
          auVar126._4_4_ = fVar138 * fStack_4a4 + fVar165 * auVar143._4_4_;
          auVar126._8_4_ = fVar162 * fStack_4a0 + fVar184 * auVar143._0_4_;
          auVar126._12_4_ = fVar163 * fStack_49c + fVar186 * auVar143._4_4_;
          auVar173._0_4_ = fVar213 * auVar102._0_4_ + fVar164 * auVar264._0_4_;
          auVar173._4_4_ = fVar138 * auVar102._4_4_ + fVar165 * auVar264._4_4_;
          auVar173._8_4_ = fVar162 * auVar102._8_4_ + fVar184 * auVar264._0_4_;
          auVar173._12_4_ = fVar163 * auVar102._12_4_ + fVar186 * auVar264._4_4_;
          auVar234._0_4_ = fVar213 * auVar289._0_4_ + fVar164 * fVar212;
          auVar234._4_4_ = fVar138 * auVar289._4_4_ + fVar165 * fVar188;
          auVar234._8_4_ = fVar162 * auVar289._8_4_ + fVar184 * fVar212;
          auVar234._12_4_ = fVar163 * auVar289._12_4_ + fVar186 * fVar188;
          auVar248._0_4_ = fVar213 * local_558 + fVar164 * auVar161._16_4_;
          auVar248._4_4_ = fVar138 * fStack_554 + fVar165 * auVar161._20_4_;
          auVar248._8_4_ = fVar162 * fStack_550 + fVar184 * auVar161._16_4_;
          auVar248._12_4_ = fVar163 * fStack_54c + fVar186 * auVar161._20_4_;
          auVar150 = vsubps_avx(auVar145,auVar103);
          auVar289 = vmovshdup_avx(_local_5c8);
          auVar205 = vmovsldup_avx(_local_5c8);
          local_5c8._0_4_ = auVar150._0_4_ * auVar205._0_4_ + auVar289._0_4_ * auVar103._0_4_;
          local_5c8._4_4_ = auVar150._4_4_ * auVar205._4_4_ + auVar289._4_4_ * auVar103._4_4_;
          fStack_5c0 = auVar150._8_4_ * auVar205._8_4_ + auVar289._8_4_ * auVar103._8_4_;
          fStack_5bc = auVar150._12_4_ * auVar205._12_4_ + auVar289._12_4_ * auVar103._12_4_;
          auVar79 = vmovshdup_avx(_local_5c8);
          auVar103 = vsubps_avx(auVar173,auVar126);
          auVar201._0_4_ = auVar103._0_4_ * 3.0;
          auVar201._4_4_ = auVar103._4_4_ * 3.0;
          auVar201._8_4_ = auVar103._8_4_ * 3.0;
          auVar201._12_4_ = auVar103._12_4_ * 3.0;
          auVar103 = vsubps_avx(auVar234,auVar173);
          auVar220._0_4_ = auVar103._0_4_ * 3.0;
          auVar220._4_4_ = auVar103._4_4_ * 3.0;
          auVar220._8_4_ = auVar103._8_4_ * 3.0;
          auVar220._12_4_ = auVar103._12_4_ * 3.0;
          auVar103 = vsubps_avx(auVar248,auVar234);
          auVar267._0_4_ = auVar103._0_4_ * 3.0;
          auVar267._4_4_ = auVar103._4_4_ * 3.0;
          auVar267._8_4_ = auVar103._8_4_ * 3.0;
          auVar267._12_4_ = auVar103._12_4_ * 3.0;
          auVar289 = vminps_avx(auVar220,auVar267);
          auVar103 = vmaxps_avx(auVar220,auVar267);
          auVar289 = vminps_avx(auVar201,auVar289);
          auVar103 = vmaxps_avx(auVar201,auVar103);
          auVar205 = vshufpd_avx(auVar289,auVar289,3);
          auVar150 = vshufpd_avx(auVar103,auVar103,3);
          auVar289 = vminps_avx(auVar289,auVar205);
          auVar103 = vmaxps_avx(auVar103,auVar150);
          auVar205 = vshufps_avx(ZEXT416((uint)(1.0 / fVar210)),ZEXT416((uint)(1.0 / fVar210)),0);
          auVar202._0_4_ = auVar205._0_4_ * auVar289._0_4_;
          auVar202._4_4_ = auVar205._4_4_ * auVar289._4_4_;
          auVar202._8_4_ = auVar205._8_4_ * auVar289._8_4_;
          auVar202._12_4_ = auVar205._12_4_ * auVar289._12_4_;
          auVar221._0_4_ = auVar103._0_4_ * auVar205._0_4_;
          auVar221._4_4_ = auVar103._4_4_ * auVar205._4_4_;
          auVar221._8_4_ = auVar103._8_4_ * auVar205._8_4_;
          auVar221._12_4_ = auVar103._12_4_ * auVar205._12_4_;
          auVar82 = ZEXT416((uint)(1.0 / (auVar79._0_4_ - (float)local_5c8._0_4_)));
          auVar103 = vshufpd_avx(auVar126,auVar126,3);
          auVar289 = vshufpd_avx(auVar173,auVar173,3);
          auVar205 = vshufpd_avx(auVar234,auVar234,3);
          auVar150 = vshufpd_avx(auVar248,auVar248,3);
          auVar103 = vsubps_avx(auVar103,auVar126);
          auVar102 = vsubps_avx(auVar289,auVar173);
          auVar149 = vsubps_avx(auVar205,auVar234);
          auVar150 = vsubps_avx(auVar150,auVar248);
          auVar289 = vminps_avx(auVar103,auVar102);
          auVar103 = vmaxps_avx(auVar103,auVar102);
          auVar205 = vminps_avx(auVar149,auVar150);
          auVar205 = vminps_avx(auVar289,auVar205);
          auVar289 = vmaxps_avx(auVar149,auVar150);
          auVar103 = vmaxps_avx(auVar103,auVar289);
          auVar289 = vshufps_avx(auVar82,auVar82,0);
          auVar277._0_4_ = auVar289._0_4_ * auVar205._0_4_;
          auVar277._4_4_ = auVar289._4_4_ * auVar205._4_4_;
          auVar277._8_4_ = auVar289._8_4_ * auVar205._8_4_;
          auVar277._12_4_ = auVar289._12_4_ * auVar205._12_4_;
          auVar290._0_4_ = auVar289._0_4_ * auVar103._0_4_;
          auVar290._4_4_ = auVar289._4_4_ * auVar103._4_4_;
          auVar290._8_4_ = auVar289._8_4_ * auVar103._8_4_;
          auVar290._12_4_ = auVar289._12_4_ * auVar103._12_4_;
          auVar103 = vmovsldup_avx(_local_5c8);
          auVar235._4_12_ = auVar103._4_12_;
          auVar235._0_4_ = fVar211;
          auVar249._4_12_ = local_5c8._4_12_;
          auVar249._0_4_ = fVar209;
          auVar83._0_4_ = (fVar209 + fVar211) * 0.5;
          auVar83._4_4_ = ((float)local_5c8._4_4_ + auVar103._4_4_) * 0.5;
          auVar83._8_4_ = (fStack_5c0 + auVar103._8_4_) * 0.5;
          auVar83._12_4_ = (fStack_5bc + auVar103._12_4_) * 0.5;
          auVar103 = vshufps_avx(auVar83,auVar83,0);
          fVar212 = auVar103._0_4_;
          fVar213 = auVar103._4_4_;
          fVar138 = auVar103._8_4_;
          fVar162 = auVar103._12_4_;
          local_468 = auVar6._0_4_;
          fStack_464 = auVar6._4_4_;
          fStack_460 = auVar6._8_4_;
          fStack_45c = auVar6._12_4_;
          auVar174._0_4_ = fVar212 * (float)local_258._0_4_ + local_468;
          auVar174._4_4_ = fVar213 * (float)local_258._4_4_ + fStack_464;
          auVar174._8_4_ = fVar138 * fStack_250 + fStack_460;
          auVar174._12_4_ = fVar162 * fStack_24c + fStack_45c;
          local_478 = auVar7._0_4_;
          fStack_474 = auVar7._4_4_;
          fStack_470 = auVar7._8_4_;
          fStack_46c = auVar7._12_4_;
          auVar268._0_4_ = fVar212 * (float)local_268._0_4_ + local_478;
          auVar268._4_4_ = fVar213 * (float)local_268._4_4_ + fStack_474;
          auVar268._8_4_ = fVar138 * fStack_260 + fStack_470;
          auVar268._12_4_ = fVar162 * fStack_25c + fStack_46c;
          local_488 = auVar8._0_4_;
          fStack_484 = auVar8._4_4_;
          fStack_480 = auVar8._8_4_;
          fStack_47c = auVar8._12_4_;
          auVar302._0_4_ = fVar212 * (float)local_278._0_4_ + local_488;
          auVar302._4_4_ = fVar213 * (float)local_278._4_4_ + fStack_484;
          auVar302._8_4_ = fVar138 * fStack_270 + fStack_480;
          auVar302._12_4_ = fVar162 * fStack_26c + fStack_47c;
          auVar103 = vsubps_avx(auVar268,auVar174);
          auVar175._0_4_ = auVar103._0_4_ * fVar212 + auVar174._0_4_;
          auVar175._4_4_ = auVar103._4_4_ * fVar213 + auVar174._4_4_;
          auVar175._8_4_ = auVar103._8_4_ * fVar138 + auVar174._8_4_;
          auVar175._12_4_ = auVar103._12_4_ * fVar162 + auVar174._12_4_;
          auVar103 = vsubps_avx(auVar302,auVar268);
          auVar269._0_4_ = auVar268._0_4_ + auVar103._0_4_ * fVar212;
          auVar269._4_4_ = auVar268._4_4_ + auVar103._4_4_ * fVar213;
          auVar269._8_4_ = auVar268._8_4_ + auVar103._8_4_ * fVar138;
          auVar269._12_4_ = auVar268._12_4_ + auVar103._12_4_ * fVar162;
          auVar103 = vsubps_avx(auVar269,auVar175);
          fVar212 = auVar175._0_4_ + auVar103._0_4_ * fVar212;
          fVar213 = auVar175._4_4_ + auVar103._4_4_ * fVar213;
          auVar127._0_8_ = CONCAT44(fVar213,fVar212);
          auVar127._8_4_ = auVar175._8_4_ + auVar103._8_4_ * fVar138;
          auVar127._12_4_ = auVar175._12_4_ + auVar103._12_4_ * fVar162;
          fVar138 = auVar103._0_4_ * 3.0;
          fVar162 = auVar103._4_4_ * 3.0;
          auVar176._0_8_ = CONCAT44(fVar162,fVar138);
          auVar176._8_4_ = auVar103._8_4_ * 3.0;
          auVar176._12_4_ = auVar103._12_4_ * 3.0;
          auVar270._8_8_ = auVar127._0_8_;
          auVar270._0_8_ = auVar127._0_8_;
          auVar103 = vshufpd_avx(auVar127,auVar127,3);
          auVar289 = vshufps_avx(auVar83,auVar83,0x55);
          auVar149 = vsubps_avx(auVar103,auVar270);
          auVar271._0_4_ = auVar289._0_4_ * auVar149._0_4_ + fVar212;
          auVar271._4_4_ = auVar289._4_4_ * auVar149._4_4_ + fVar213;
          auVar271._8_4_ = auVar289._8_4_ * auVar149._8_4_ + fVar212;
          auVar271._12_4_ = auVar289._12_4_ * auVar149._12_4_ + fVar213;
          auVar320._8_8_ = auVar176._0_8_;
          auVar320._0_8_ = auVar176._0_8_;
          auVar103 = vshufpd_avx(auVar176,auVar176,1);
          auVar103 = vsubps_avx(auVar103,auVar320);
          auVar177._0_4_ = fVar138 + auVar289._0_4_ * auVar103._0_4_;
          auVar177._4_4_ = fVar162 + auVar289._4_4_ * auVar103._4_4_;
          auVar177._8_4_ = fVar138 + auVar289._8_4_ * auVar103._8_4_;
          auVar177._12_4_ = fVar162 + auVar289._12_4_ * auVar103._12_4_;
          auVar289 = vmovshdup_avx(auVar177);
          auVar321._0_8_ = auVar289._0_8_ ^ 0x8000000080000000;
          auVar321._8_4_ = auVar289._8_4_ ^ 0x80000000;
          auVar321._12_4_ = auVar289._12_4_ ^ 0x80000000;
          auVar205 = vmovshdup_avx(auVar149);
          auVar103 = vunpcklps_avx(auVar205,auVar321);
          auVar150 = vshufps_avx(auVar103,auVar321,4);
          auVar128._0_8_ = auVar149._0_8_ ^ 0x8000000080000000;
          auVar128._8_4_ = -auVar149._8_4_;
          auVar128._12_4_ = -auVar149._12_4_;
          auVar103 = vmovlhps_avx(auVar128,auVar177);
          auVar102 = vshufps_avx(auVar103,auVar177,8);
          auVar103 = ZEXT416((uint)(auVar205._0_4_ * auVar177._0_4_ -
                                   auVar289._0_4_ * auVar149._0_4_));
          auVar289 = vshufps_avx(auVar103,auVar103,0);
          auVar103 = vdivps_avx(auVar150,auVar289);
          auVar289 = vdivps_avx(auVar102,auVar289);
          auVar102 = vinsertps_avx(auVar202,auVar277,0x1c);
          auVar149 = vinsertps_avx(auVar221,auVar290,0x1c);
          auVar82 = vinsertps_avx(auVar277,auVar202,0x4c);
          auVar124 = vinsertps_avx(auVar290,auVar221,0x4c);
          auVar205 = vmovsldup_avx(auVar103);
          auVar291._0_4_ = auVar205._0_4_ * auVar102._0_4_;
          auVar291._4_4_ = auVar205._4_4_ * auVar102._4_4_;
          auVar291._8_4_ = auVar205._8_4_ * auVar102._8_4_;
          auVar291._12_4_ = auVar205._12_4_ * auVar102._12_4_;
          auVar278._0_4_ = auVar205._0_4_ * auVar149._0_4_;
          auVar278._4_4_ = auVar205._4_4_ * auVar149._4_4_;
          auVar278._8_4_ = auVar205._8_4_ * auVar149._8_4_;
          auVar278._12_4_ = auVar205._12_4_ * auVar149._12_4_;
          auVar150 = vminps_avx(auVar291,auVar278);
          auVar205 = vmaxps_avx(auVar278,auVar291);
          auVar262 = vmovsldup_avx(auVar289);
          auVar344._0_4_ = auVar262._0_4_ * auVar82._0_4_;
          auVar344._4_4_ = auVar262._4_4_ * auVar82._4_4_;
          auVar344._8_4_ = auVar262._8_4_ * auVar82._8_4_;
          auVar344._12_4_ = auVar262._12_4_ * auVar82._12_4_;
          auVar279._0_4_ = auVar262._0_4_ * auVar124._0_4_;
          auVar279._4_4_ = auVar262._4_4_ * auVar124._4_4_;
          auVar279._8_4_ = auVar262._8_4_ * auVar124._8_4_;
          auVar279._12_4_ = auVar262._12_4_ * auVar124._12_4_;
          auVar262 = vminps_avx(auVar344,auVar279);
          auVar106._0_4_ = auVar150._0_4_ + auVar262._0_4_;
          auVar106._4_4_ = auVar150._4_4_ + auVar262._4_4_;
          auVar106._8_4_ = auVar150._8_4_ + auVar262._8_4_;
          auVar106._12_4_ = auVar150._12_4_ + auVar262._12_4_;
          auVar150 = vmaxps_avx(auVar279,auVar344);
          auVar262 = vsubps_avx(auVar235,auVar83);
          auVar93 = vsubps_avx(auVar249,auVar83);
          auVar250._0_4_ = auVar205._0_4_ + auVar150._0_4_;
          auVar250._4_4_ = auVar205._4_4_ + auVar150._4_4_;
          auVar250._8_4_ = auVar205._8_4_ + auVar150._8_4_;
          auVar250._12_4_ = auVar205._12_4_ + auVar150._12_4_;
          auVar292._8_8_ = 0x3f800000;
          auVar292._0_8_ = 0x3f800000;
          auVar205 = vsubps_avx(auVar292,auVar250);
          auVar150 = vsubps_avx(auVar292,auVar106);
          fVar165 = auVar262._0_4_;
          auVar293._0_4_ = fVar165 * auVar205._0_4_;
          fVar184 = auVar262._4_4_;
          auVar293._4_4_ = fVar184 * auVar205._4_4_;
          fVar186 = auVar262._8_4_;
          auVar293._8_4_ = fVar186 * auVar205._8_4_;
          fVar188 = auVar262._12_4_;
          auVar293._12_4_ = fVar188 * auVar205._12_4_;
          fVar138 = auVar93._0_4_;
          auVar251._0_4_ = auVar205._0_4_ * fVar138;
          fVar162 = auVar93._4_4_;
          auVar251._4_4_ = auVar205._4_4_ * fVar162;
          fVar163 = auVar93._8_4_;
          auVar251._8_4_ = auVar205._8_4_ * fVar163;
          fVar164 = auVar93._12_4_;
          auVar251._12_4_ = auVar205._12_4_ * fVar164;
          auVar333._0_4_ = fVar165 * auVar150._0_4_;
          auVar333._4_4_ = fVar184 * auVar150._4_4_;
          auVar333._8_4_ = fVar186 * auVar150._8_4_;
          auVar333._12_4_ = fVar188 * auVar150._12_4_;
          auVar107._0_4_ = fVar138 * auVar150._0_4_;
          auVar107._4_4_ = fVar162 * auVar150._4_4_;
          auVar107._8_4_ = fVar163 * auVar150._8_4_;
          auVar107._12_4_ = fVar164 * auVar150._12_4_;
          auVar205 = vminps_avx(auVar293,auVar333);
          auVar150 = vminps_avx(auVar251,auVar107);
          auVar262 = vminps_avx(auVar205,auVar150);
          auVar205 = vmaxps_avx(auVar333,auVar293);
          auVar150 = vmaxps_avx(auVar107,auVar251);
          auVar93 = vshufps_avx(auVar83,auVar83,0x54);
          auVar150 = vmaxps_avx(auVar150,auVar205);
          auVar94 = vshufps_avx(auVar271,auVar271,0);
          auVar118 = vshufps_avx(auVar271,auVar271,0x55);
          auVar205 = vhaddps_avx(auVar262,auVar262);
          auVar150 = vhaddps_avx(auVar150,auVar150);
          auVar252._0_4_ = auVar94._0_4_ * auVar103._0_4_ + auVar118._0_4_ * auVar289._0_4_;
          auVar252._4_4_ = auVar94._4_4_ * auVar103._4_4_ + auVar118._4_4_ * auVar289._4_4_;
          auVar252._8_4_ = auVar94._8_4_ * auVar103._8_4_ + auVar118._8_4_ * auVar289._8_4_;
          auVar252._12_4_ = auVar94._12_4_ * auVar103._12_4_ + auVar118._12_4_ * auVar289._12_4_;
          auVar262 = vsubps_avx(auVar93,auVar252);
          fVar212 = auVar262._0_4_ + auVar205._0_4_;
          fVar213 = auVar262._0_4_ + auVar150._0_4_;
          auVar205 = vmaxss_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar212));
          auVar150 = vminss_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar209));
          if (auVar205._0_4_ <= auVar150._0_4_) {
            auVar205 = vmovshdup_avx(auVar103);
            auVar146._0_4_ = auVar102._0_4_ * auVar205._0_4_;
            auVar146._4_4_ = auVar102._4_4_ * auVar205._4_4_;
            auVar146._8_4_ = auVar102._8_4_ * auVar205._8_4_;
            auVar146._12_4_ = auVar102._12_4_ * auVar205._12_4_;
            auVar108._0_4_ = auVar149._0_4_ * auVar205._0_4_;
            auVar108._4_4_ = auVar149._4_4_ * auVar205._4_4_;
            auVar108._8_4_ = auVar149._8_4_ * auVar205._8_4_;
            auVar108._12_4_ = auVar149._12_4_ * auVar205._12_4_;
            auVar150 = vminps_avx(auVar146,auVar108);
            auVar205 = vmaxps_avx(auVar108,auVar146);
            auVar102 = vmovshdup_avx(auVar289);
            auVar203._0_4_ = auVar102._0_4_ * auVar82._0_4_;
            auVar203._4_4_ = auVar102._4_4_ * auVar82._4_4_;
            auVar203._8_4_ = auVar102._8_4_ * auVar82._8_4_;
            auVar203._12_4_ = auVar102._12_4_ * auVar82._12_4_;
            auVar147._0_4_ = auVar102._0_4_ * auVar124._0_4_;
            auVar147._4_4_ = auVar102._4_4_ * auVar124._4_4_;
            auVar147._8_4_ = auVar102._8_4_ * auVar124._8_4_;
            auVar147._12_4_ = auVar102._12_4_ * auVar124._12_4_;
            auVar102 = vminps_avx(auVar203,auVar147);
            auVar222._0_4_ = auVar150._0_4_ + auVar102._0_4_;
            auVar222._4_4_ = auVar150._4_4_ + auVar102._4_4_;
            auVar222._8_4_ = auVar150._8_4_ + auVar102._8_4_;
            auVar222._12_4_ = auVar150._12_4_ + auVar102._12_4_;
            auVar150 = vmaxps_avx(auVar147,auVar203);
            auVar109._0_4_ = auVar205._0_4_ + auVar150._0_4_;
            auVar109._4_4_ = auVar205._4_4_ + auVar150._4_4_;
            auVar109._8_4_ = auVar205._8_4_ + auVar150._8_4_;
            auVar109._12_4_ = auVar205._12_4_ + auVar150._12_4_;
            auVar205 = vsubps_avx(auVar144,auVar109);
            auVar150 = vsubps_avx(auVar144,auVar222);
            auVar204._0_4_ = fVar165 * auVar205._0_4_;
            auVar204._4_4_ = fVar184 * auVar205._4_4_;
            auVar204._8_4_ = fVar186 * auVar205._8_4_;
            auVar204._12_4_ = fVar188 * auVar205._12_4_;
            auVar223._0_4_ = fVar165 * auVar150._0_4_;
            auVar223._4_4_ = fVar184 * auVar150._4_4_;
            auVar223._8_4_ = fVar186 * auVar150._8_4_;
            auVar223._12_4_ = fVar188 * auVar150._12_4_;
            auVar110._0_4_ = fVar138 * auVar205._0_4_;
            auVar110._4_4_ = fVar162 * auVar205._4_4_;
            auVar110._8_4_ = fVar163 * auVar205._8_4_;
            auVar110._12_4_ = fVar164 * auVar205._12_4_;
            auVar148._0_4_ = fVar138 * auVar150._0_4_;
            auVar148._4_4_ = fVar162 * auVar150._4_4_;
            auVar148._8_4_ = fVar163 * auVar150._8_4_;
            auVar148._12_4_ = fVar164 * auVar150._12_4_;
            auVar205 = vminps_avx(auVar204,auVar223);
            auVar150 = vminps_avx(auVar110,auVar148);
            auVar205 = vminps_avx(auVar205,auVar150);
            auVar150 = vmaxps_avx(auVar223,auVar204);
            auVar102 = vmaxps_avx(auVar148,auVar110);
            auVar205 = vhaddps_avx(auVar205,auVar205);
            auVar150 = vmaxps_avx(auVar102,auVar150);
            auVar150 = vhaddps_avx(auVar150,auVar150);
            auVar102 = vmovshdup_avx(auVar262);
            auVar149 = ZEXT416((uint)(auVar102._0_4_ + auVar205._0_4_));
            auVar205 = vmaxss_avx(_local_5c8,auVar149);
            auVar102 = ZEXT416((uint)(auVar102._0_4_ + auVar150._0_4_));
            auVar150 = vminss_avx(auVar102,auVar79);
            if (auVar205._0_4_ <= auVar150._0_4_) {
              uVar69 = 0;
              auVar335 = ZEXT864(0) << 0x20;
              if (fVar212 <= fVar211) {
                auVar322._8_4_ = 0x7fffffff;
                auVar322._0_8_ = 0x7fffffff7fffffff;
                auVar322._12_4_ = 0x7fffffff;
              }
              else {
                auVar322._8_4_ = 0x7fffffff;
                auVar322._0_8_ = 0x7fffffff7fffffff;
                auVar322._12_4_ = 0x7fffffff;
                uVar69 = 0;
                if (fVar213 < fVar209) {
                  auVar205 = vcmpps_avx(auVar102,auVar79,1);
                  auVar150 = vcmpps_avx(_local_5c8,auVar149,1);
                  auVar205 = vandps_avx(auVar150,auVar205);
                  uVar69 = auVar205._0_4_;
                }
              }
              if (((uint)uVar72 < 4 && 0.001 <= fVar210) && (uVar69 & 1) == 0) {
                bVar60 = false;
              }
              else {
                lVar76 = 200;
                do {
                  fVar212 = auVar262._0_4_;
                  fVar210 = 1.0 - fVar212;
                  auVar205 = ZEXT416((uint)(fVar210 * fVar210 * fVar210));
                  auVar205 = vshufps_avx(auVar205,auVar205,0);
                  auVar150 = ZEXT416((uint)(fVar212 * 3.0 * fVar210 * fVar210));
                  auVar150 = vshufps_avx(auVar150,auVar150,0);
                  auVar102 = ZEXT416((uint)(fVar210 * fVar212 * fVar212 * 3.0));
                  auVar102 = vshufps_avx(auVar102,auVar102,0);
                  auVar149 = ZEXT416((uint)(fVar212 * fVar212 * fVar212));
                  auVar149 = vshufps_avx(auVar149,auVar149,0);
                  fVar210 = local_468 * auVar205._0_4_ +
                            local_478 * auVar150._0_4_ +
                            (float)local_3c8._0_4_ * auVar149._0_4_ + local_488 * auVar102._0_4_;
                  fVar212 = fStack_464 * auVar205._4_4_ +
                            fStack_474 * auVar150._4_4_ +
                            (float)local_3c8._4_4_ * auVar149._4_4_ + fStack_484 * auVar102._4_4_;
                  auVar111._0_8_ = CONCAT44(fVar212,fVar210);
                  auVar111._8_4_ =
                       fStack_460 * auVar205._8_4_ +
                       fStack_470 * auVar150._8_4_ +
                       fStack_3c0 * auVar149._8_4_ + fStack_480 * auVar102._8_4_;
                  auVar111._12_4_ =
                       fStack_45c * auVar205._12_4_ +
                       fStack_46c * auVar150._12_4_ +
                       fStack_3bc * auVar149._12_4_ + fStack_47c * auVar102._12_4_;
                  auVar151._8_8_ = auVar111._0_8_;
                  auVar151._0_8_ = auVar111._0_8_;
                  auVar150 = vshufpd_avx(auVar111,auVar111,1);
                  auVar205 = vmovshdup_avx(auVar262);
                  auVar150 = vsubps_avx(auVar150,auVar151);
                  auVar112._0_4_ = auVar205._0_4_ * auVar150._0_4_ + fVar210;
                  auVar112._4_4_ = auVar205._4_4_ * auVar150._4_4_ + fVar212;
                  auVar112._8_4_ = auVar205._8_4_ * auVar150._8_4_ + fVar210;
                  auVar112._12_4_ = auVar205._12_4_ * auVar150._12_4_ + fVar212;
                  auVar205 = vshufps_avx(auVar112,auVar112,0);
                  auVar150 = vshufps_avx(auVar112,auVar112,0x55);
                  auVar152._0_4_ = auVar103._0_4_ * auVar205._0_4_ + auVar289._0_4_ * auVar150._0_4_
                  ;
                  auVar152._4_4_ = auVar103._4_4_ * auVar205._4_4_ + auVar289._4_4_ * auVar150._4_4_
                  ;
                  auVar152._8_4_ = auVar103._8_4_ * auVar205._8_4_ + auVar289._8_4_ * auVar150._8_4_
                  ;
                  auVar152._12_4_ =
                       auVar103._12_4_ * auVar205._12_4_ + auVar289._12_4_ * auVar150._12_4_;
                  auVar262 = vsubps_avx(auVar262,auVar152);
                  auVar205 = vandps_avx(auVar322,auVar112);
                  auVar150 = vshufps_avx(auVar205,auVar205,0xf5);
                  auVar205 = vmaxss_avx(auVar150,auVar205);
                  if (auVar205._0_4_ < fVar208) {
                    fVar210 = auVar262._0_4_;
                    if ((0.0 <= fVar210) && (fVar210 <= 1.0)) {
                      auVar103 = vmovshdup_avx(auVar262);
                      fVar212 = auVar103._0_4_;
                      if ((0.0 <= fVar212) && (fVar212 <= 1.0)) {
                        auVar103 = vinsertps_avx(ZEXT416((uint)(pLVar77->vx).field_0.m128[2]),
                                                 ZEXT416((uint)(pLVar77->vy).field_0.m128[2]),0x1c);
                        auVar124 = vinsertps_avx(auVar103,ZEXT416((uint)(pLVar77->vz).field_0.m128
                                                                        [2]),0x28);
                        auVar103 = vdpps_avx(auVar124,local_288,0x7f);
                        auVar289 = vdpps_avx(auVar124,local_298,0x7f);
                        auVar205 = vdpps_avx(auVar124,local_2c8,0x7f);
                        auVar150 = vdpps_avx(auVar124,local_2d8,0x7f);
                        auVar102 = vdpps_avx(auVar124,local_2e8,0x7f);
                        auVar149 = vdpps_avx(auVar124,local_2f8,0x7f);
                        fVar164 = 1.0 - fVar212;
                        auVar82 = vdpps_avx(auVar124,local_2a8,0x7f);
                        auVar124 = vdpps_avx(auVar124,local_2b8,0x7f);
                        fVar165 = 1.0 - fVar210;
                        fVar213 = auVar262._4_4_;
                        fVar138 = auVar262._8_4_;
                        fVar162 = auVar262._12_4_;
                        fVar163 = fVar165 * fVar210 * fVar210 * 3.0;
                        auVar206._0_4_ = fVar210 * fVar210 * fVar210;
                        auVar206._4_4_ = fVar213 * fVar213 * fVar213;
                        auVar206._8_4_ = fVar138 * fVar138 * fVar138;
                        auVar206._12_4_ = fVar162 * fVar162 * fVar162;
                        fVar213 = fVar210 * 3.0 * fVar165 * fVar165;
                        fVar138 = fVar165 * fVar165 * fVar165;
                        fVar210 = (fVar164 * auVar103._0_4_ + fVar212 * auVar205._0_4_) * fVar138 +
                                  (fVar164 * auVar289._0_4_ + fVar212 * auVar150._0_4_) * fVar213 +
                                  fVar163 * (fVar164 * auVar82._0_4_ + fVar212 * auVar102._0_4_) +
                                  auVar206._0_4_ *
                                  (auVar149._0_4_ * fVar212 + fVar164 * auVar124._0_4_);
                        if ((fVar189 <= fVar210) &&
                           (fVar212 = *(float *)(ray + k * 4 + 0x80), fVar210 <= fVar212)) {
                          pGVar10 = (context->scene->geometries).items[uVar71].ptr;
                          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar78 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar78 = true,
                                  pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1c8 = vshufps_avx(auVar262,auVar262,0x55);
                            auVar253._8_4_ = 0x3f800000;
                            auVar253._0_8_ = &DAT_3f8000003f800000;
                            auVar253._12_4_ = 0x3f800000;
                            auVar103 = vsubps_avx(auVar253,local_1c8);
                            fVar162 = local_1c8._0_4_;
                            fVar164 = local_1c8._4_4_;
                            fVar184 = local_1c8._8_4_;
                            fVar186 = local_1c8._12_4_;
                            fVar188 = auVar103._0_4_;
                            fVar285 = auVar103._4_4_;
                            fVar287 = auVar103._8_4_;
                            fVar297 = auVar103._12_4_;
                            auVar272._0_4_ =
                                 fVar162 * (float)local_3e8._0_4_ + fVar188 * (float)local_3d8._0_4_
                            ;
                            auVar272._4_4_ =
                                 fVar164 * (float)local_3e8._4_4_ + fVar285 * (float)local_3d8._4_4_
                            ;
                            auVar272._8_4_ = fVar184 * fStack_3e0 + fVar287 * fStack_3d0;
                            auVar272._12_4_ = fVar186 * fStack_3dc + fVar297 * fStack_3cc;
                            auVar280._0_4_ =
                                 fVar162 * (float)local_428._0_4_ + fVar188 * (float)local_408._0_4_
                            ;
                            auVar280._4_4_ =
                                 fVar164 * (float)local_428._4_4_ + fVar285 * (float)local_408._4_4_
                            ;
                            auVar280._8_4_ = fVar184 * fStack_420 + fVar287 * fStack_400;
                            auVar280._12_4_ = fVar186 * fStack_41c + fVar297 * fStack_3fc;
                            auVar294._0_4_ =
                                 fVar162 * (float)local_318._0_4_ + fVar188 * (float)local_418._0_4_
                            ;
                            auVar294._4_4_ =
                                 fVar164 * (float)local_318._4_4_ + fVar285 * (float)local_418._4_4_
                            ;
                            auVar294._8_4_ = fVar184 * fStack_310 + fVar287 * fStack_410;
                            auVar294._12_4_ = fVar186 * fStack_30c + fVar297 * fStack_40c;
                            auVar254._0_4_ = fVar162 * fVar185 + fVar188 * (float)local_3f8._0_4_;
                            auVar254._4_4_ = fVar164 * fVar187 + fVar285 * (float)local_3f8._4_4_;
                            auVar254._8_4_ = fVar184 * fVar284 + fVar287 * fStack_3f0;
                            auVar254._12_4_ = fVar186 * fVar286 + fVar297 * fStack_3ec;
                            auVar150 = vsubps_avx(auVar280,auVar272);
                            auVar102 = vsubps_avx(auVar294,auVar280);
                            auVar149 = vsubps_avx(auVar254,auVar294);
                            local_1d8 = vshufps_avx(auVar262,auVar262,0);
                            fVar162 = local_1d8._0_4_;
                            fVar184 = local_1d8._4_4_;
                            fVar186 = local_1d8._8_4_;
                            fVar285 = local_1d8._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),0);
                            fVar164 = auVar103._0_4_;
                            fVar165 = auVar103._4_4_;
                            fVar188 = auVar103._8_4_;
                            fVar287 = auVar103._12_4_;
                            auVar103 = vshufps_avx(auVar206,auVar206,0);
                            auVar289 = vshufps_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),0);
                            auVar205 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                            auVar178._0_4_ =
                                 ((auVar102._0_4_ * fVar164 + auVar149._0_4_ * fVar162) * fVar162 +
                                 (auVar150._0_4_ * fVar164 + auVar102._0_4_ * fVar162) * fVar164) *
                                 3.0;
                            auVar178._4_4_ =
                                 ((auVar102._4_4_ * fVar165 + auVar149._4_4_ * fVar184) * fVar184 +
                                 (auVar150._4_4_ * fVar165 + auVar102._4_4_ * fVar184) * fVar165) *
                                 3.0;
                            auVar178._8_4_ =
                                 ((auVar102._8_4_ * fVar188 + auVar149._8_4_ * fVar186) * fVar186 +
                                 (auVar150._8_4_ * fVar188 + auVar102._8_4_ * fVar186) * fVar188) *
                                 3.0;
                            auVar178._12_4_ =
                                 ((auVar102._12_4_ * fVar287 + auVar149._12_4_ * fVar285) * fVar285
                                 + (auVar150._12_4_ * fVar287 + auVar102._12_4_ * fVar285) * fVar287
                                 ) * 3.0;
                            auVar150 = vshufps_avx(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),0);
                            auVar129._0_4_ =
                                 auVar150._0_4_ * (float)local_348._0_4_ +
                                 auVar205._0_4_ * (float)local_358._0_4_ +
                                 auVar103._0_4_ * (float)local_378._0_4_ +
                                 auVar289._0_4_ * (float)local_368._0_4_;
                            auVar129._4_4_ =
                                 auVar150._4_4_ * (float)local_348._4_4_ +
                                 auVar205._4_4_ * (float)local_358._4_4_ +
                                 auVar103._4_4_ * (float)local_378._4_4_ +
                                 auVar289._4_4_ * (float)local_368._4_4_;
                            auVar129._8_4_ =
                                 auVar150._8_4_ * fStack_340 +
                                 auVar205._8_4_ * fStack_350 +
                                 auVar103._8_4_ * fStack_370 + auVar289._8_4_ * fStack_360;
                            auVar129._12_4_ =
                                 auVar150._12_4_ * fStack_33c +
                                 auVar205._12_4_ * fStack_34c +
                                 auVar103._12_4_ * fStack_36c + auVar289._12_4_ * fStack_35c;
                            auVar103 = vshufps_avx(auVar178,auVar178,0xc9);
                            auVar153._0_4_ = auVar129._0_4_ * auVar103._0_4_;
                            auVar153._4_4_ = auVar129._4_4_ * auVar103._4_4_;
                            auVar153._8_4_ = auVar129._8_4_ * auVar103._8_4_;
                            auVar153._12_4_ = auVar129._12_4_ * auVar103._12_4_;
                            auVar103 = vshufps_avx(auVar129,auVar129,0xc9);
                            auVar130._0_4_ = auVar178._0_4_ * auVar103._0_4_;
                            auVar130._4_4_ = auVar178._4_4_ * auVar103._4_4_;
                            auVar130._8_4_ = auVar178._8_4_ * auVar103._8_4_;
                            auVar130._12_4_ = auVar178._12_4_ * auVar103._12_4_;
                            auVar289 = vsubps_avx(auVar130,auVar153);
                            auVar103 = vshufps_avx(auVar289,auVar289,0x55);
                            local_208[0] = (RTCHitN)auVar103[0];
                            local_208[1] = (RTCHitN)auVar103[1];
                            local_208[2] = (RTCHitN)auVar103[2];
                            local_208[3] = (RTCHitN)auVar103[3];
                            local_208[4] = (RTCHitN)auVar103[4];
                            local_208[5] = (RTCHitN)auVar103[5];
                            local_208[6] = (RTCHitN)auVar103[6];
                            local_208[7] = (RTCHitN)auVar103[7];
                            local_208[8] = (RTCHitN)auVar103[8];
                            local_208[9] = (RTCHitN)auVar103[9];
                            local_208[10] = (RTCHitN)auVar103[10];
                            local_208[0xb] = (RTCHitN)auVar103[0xb];
                            local_208[0xc] = (RTCHitN)auVar103[0xc];
                            local_208[0xd] = (RTCHitN)auVar103[0xd];
                            local_208[0xe] = (RTCHitN)auVar103[0xe];
                            local_208[0xf] = (RTCHitN)auVar103[0xf];
                            local_1f8 = vshufps_avx(auVar289,auVar289,0xaa);
                            local_1e8 = vshufps_avx(auVar289,auVar289,0);
                            local_1b8 = local_338._0_8_;
                            uStack_1b0 = local_338._8_8_;
                            local_1a8 = local_328._0_8_;
                            uStack_1a0 = local_328._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_194 = context->user->instID[0];
                            local_198 = uStack_194;
                            uStack_190 = uStack_194;
                            uStack_18c = uStack_194;
                            uStack_188 = context->user->instPrimID[0];
                            uStack_184 = uStack_188;
                            uStack_180 = uStack_188;
                            uStack_17c = uStack_188;
                            *(float *)(ray + k * 4 + 0x80) = fVar210;
                            local_448 = *local_438;
                            uStack_440 = local_438[1];
                            local_3a8.valid = (int *)&local_448;
                            local_3a8.geometryUserPtr = pGVar10->userPtr;
                            local_3a8.context = context->user;
                            local_3a8.ray = (RTCRayN *)ray;
                            local_3a8.hit = local_208;
                            local_3a8.N = 4;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->occlusionFilterN)(&local_3a8);
                            }
                            auVar65._8_8_ = uStack_440;
                            auVar65._0_8_ = local_448;
                            if (auVar65 == (undefined1  [16])0x0) {
                              auVar335 = ZEXT1664(ZEXT816(0));
                              auVar103 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar103 = auVar103 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var13 = context->args->filter;
                              auVar335 = ZEXT1664(ZEXT816(0));
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var13)(&local_3a8);
                                auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar66._8_8_ = uStack_440;
                              auVar66._0_8_ = local_448;
                              auVar289 = vpcmpeqd_avx(auVar335._0_16_,auVar66);
                              auVar103 = auVar289 ^ _DAT_01febe20;
                              auVar131._8_4_ = 0xff800000;
                              auVar131._0_8_ = 0xff800000ff800000;
                              auVar131._12_4_ = 0xff800000;
                              auVar289 = vblendvps_avx(auVar131,*(undefined1 (*) [16])
                                                                 (local_3a8.ray + 0x80),auVar289);
                              *(undefined1 (*) [16])(local_3a8.ray + 0x80) = auVar289;
                            }
                            auVar103 = vpslld_avx(auVar103,0x1f);
                            iVar70 = vmovmskps_avx(auVar103);
                            if (iVar70 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar212;
                            }
                            bVar78 = (char)iVar70 != '\0';
                          }
                          bVar67 = (bool)(bVar67 | bVar78);
                          pLVar77 = local_430;
                        }
                      }
                    }
                    break;
                  }
                  lVar76 = lVar76 + -1;
                } while (lVar76 != 0);
              }
              goto LAB_0113fa0a;
            }
          }
          goto LAB_0113fdd2;
        }
      }
LAB_0113fa0a:
    } while (bVar60);
    local_308 = vinsertps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar209),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }